

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance_array_intersector.cpp
# Opt level: O1

bool embree::avx::InstanceArrayIntersector1MB::pointQuery
               (PointQuery *query,PointQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  uint uVar2;
  undefined8 uVar3;
  int iVar4;
  Geometry *pGVar5;
  RTCPointQueryContext *pRVar6;
  float fVar7;
  float fVar8;
  undefined1 uVar9;
  ulong uVar10;
  long lVar11;
  int iVar12;
  uint uVar13;
  Ref<embree::Geometry> *pRVar14;
  long *plVar15;
  uint uVar16;
  bool bVar17;
  long lVar18;
  long lVar19;
  _func_int *p_Var20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 in_ZMM0 [64];
  float fVar76;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 in_ZMM1 [64];
  undefined1 auVar91 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 in_ZMM2 [64];
  vfloat4 a0;
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 in_ZMM3 [64];
  float fVar113;
  vfloat4 a0_1;
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar119;
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 in_ZMM4 [64];
  float fVar131;
  vfloat4 b0;
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  float fVar138;
  float fVar139;
  float fVar140;
  undefined1 in_ZMM5 [64];
  float fVar141;
  float fVar142;
  undefined1 auVar143 [16];
  float fVar144;
  float fVar145;
  float fVar146;
  undefined1 in_ZMM6 [64];
  float fVar147;
  undefined1 auVar148 [16];
  float fVar149;
  float fVar150;
  float fVar151;
  undefined1 in_ZMM7 [64];
  float fVar156;
  vfloat4 a1;
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar157 [16];
  undefined1 in_ZMM9 [64];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 in_ZMM11 [64];
  undefined1 in_ZMM12 [64];
  undefined1 auVar161 [16];
  undefined1 in_ZMM13 [64];
  float fVar162;
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 in_ZMM15 [64];
  undefined1 local_268 [8];
  float fStack_260;
  float fStack_25c;
  undefined1 local_258 [8];
  float fStack_250;
  float fStack_24c;
  float local_228;
  float fStack_224;
  float fStack_220;
  float fStack_21c;
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float local_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float local_1b8;
  float local_1a8;
  float local_198;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_128;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  undefined8 local_c8;
  undefined4 local_c0;
  float local_bc;
  float local_b8;
  _func_int *local_a8;
  undefined8 local_a0;
  PointQuery *local_98;
  int local_90;
  undefined1 local_88 [16];
  float local_78;
  void *local_70;
  undefined8 local_68;
  undefined1 local_58 [8];
  float fStack_50;
  float fStack_4c;
  undefined1 local_48 [16];
  undefined1 auVar92 [16];
  
  auVar74 = in_ZMM6._0_16_;
  auVar75 = in_ZMM7._0_16_;
  auVar161 = in_ZMM13._0_16_;
  auVar71 = in_ZMM12._0_16_;
  auVar160 = in_ZMM11._0_16_;
  auVar92 = in_ZMM15._0_16_;
  b0.field_0 = in_ZMM5._0_16_;
  a0_1.field_0 = in_ZMM4._0_16_;
  a0.field_0 = in_ZMM3._0_16_;
  auVar99 = in_ZMM9._0_16_;
  auVar91 = in_ZMM2._0_16_;
  auVar70 = in_ZMM0._0_16_;
  auVar95 = in_ZMM1._0_16_;
  uVar10 = (ulong)prim->primID_;
  pRVar14 = (context->scene->geometries).items;
  pGVar5 = pRVar14[prim->instID_].ptr;
  p_Var20 = *(_func_int **)&pGVar5->field_0x58;
  if (p_Var20 == (_func_int *)0x0) {
    pRVar14 = (Ref<embree::Geometry> *)
              (ulong)*(uint *)(*(long *)&pGVar5[1].time_range.upper +
                              (long)pGVar5[1].intersectionFilterN * uVar10);
    if (pRVar14 == (Ref<embree::Geometry> *)0xffffffff) {
      p_Var20 = (_func_int *)0x0;
    }
    else {
      p_Var20 = pGVar5[1].super_RefCount._vptr_RefCount[(long)pRVar14];
    }
  }
  if (p_Var20 == (_func_int *)0x0) {
    return false;
  }
  if (pGVar5->numTimeSteps == 1) {
    plVar15 = *(long **)&pGVar5[1].fnumTimeSegments;
    iVar4 = (int)plVar15[4];
    if ((pGVar5->field_8).field_0x1 == '\x01') {
      if (iVar4 < 0x9244) {
        if (iVar4 == 0x9134) {
          lVar19 = *plVar15;
          lVar11 = uVar10 * plVar15[2];
          auVar92 = vinsertps_avx(ZEXT416(*(uint *)(lVar19 + lVar11)),
                                  ZEXT416(*(uint *)(lVar19 + 0x10 + lVar11)),0x1c);
          auVar95 = vinsertps_avx(auVar92,ZEXT416(*(uint *)(lVar19 + 0x20 + lVar11)),0x28);
          auVar92 = vinsertps_avx(ZEXT416(*(uint *)(lVar19 + 4 + lVar11)),
                                  ZEXT416(*(uint *)(lVar19 + 0x14 + lVar11)),0x1c);
          a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vinsertps_avx(auVar92,ZEXT416(*(uint *)(lVar19 + 0x24 + lVar11)),0x28);
          auVar92 = vinsertps_avx(ZEXT416(*(uint *)(lVar19 + 8 + lVar11)),
                                  ZEXT416(*(uint *)(lVar19 + 0x18 + lVar11)),0x1c);
          auVar91 = vinsertps_avx(auVar92,ZEXT416(*(uint *)(lVar19 + 0x28 + lVar11)),0x28);
          auVar92 = vinsertps_avx(ZEXT416(*(uint *)(lVar19 + 0xc + lVar11)),
                                  ZEXT416(*(uint *)(lVar19 + 0x1c + lVar11)),0x1c);
          auVar70 = vinsertps_avx(auVar92,ZEXT416(*(uint *)(lVar19 + 0x2c + lVar11)),0x28);
        }
        else if (iVar4 == 0x9234) {
          lVar19 = *plVar15;
          lVar11 = uVar10 * plVar15[2];
          auVar38._8_8_ = 0;
          auVar38._0_8_ = *(ulong *)(lVar19 + 4 + lVar11);
          auVar92 = vshufps_avx(ZEXT416(*(uint *)(lVar19 + lVar11)),auVar38,0x4c);
          auVar95 = vshufps_avx(auVar92,auVar92,0x78);
          auVar39._8_8_ = 0;
          auVar39._0_8_ = *(ulong *)(lVar19 + 0x10 + lVar11);
          auVar92 = vshufps_avx(ZEXT416(*(uint *)(lVar19 + 0xc + lVar11)),auVar39,0x4c);
          a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vshufps_avx(auVar92,auVar92,0x78);
          auVar40._8_8_ = 0;
          auVar40._0_8_ = *(ulong *)(lVar19 + 0x1c + lVar11);
          auVar92 = vshufps_avx(ZEXT416(*(uint *)(lVar19 + 0x18 + lVar11)),auVar40,0x4c);
          auVar91 = vshufps_avx(auVar92,auVar92,0x78);
          auVar41._8_8_ = 0;
          auVar41._0_8_ = *(ulong *)(lVar19 + 0x28 + lVar11);
          auVar92 = vshufps_avx(ZEXT416(*(uint *)(lVar19 + 0x24 + lVar11)),auVar41,0x4c);
          auVar70 = vshufps_avx(auVar92,auVar92,0x78);
        }
      }
      else if (iVar4 == 0xb001) {
        lVar19 = *plVar15;
        lVar11 = uVar10 * plVar15[2];
        auVar54._8_8_ = 0;
        auVar54._0_8_ = *(ulong *)(lVar19 + 0x10 + lVar11);
        auVar92 = vinsertps_avx(auVar54,ZEXT416(*(uint *)(lVar19 + 8 + lVar11)),0x20);
        auVar55._8_8_ = 0;
        auVar55._0_8_ = *(ulong *)(lVar19 + 0x34 + lVar11);
        auVar71 = vmovlhps_avx(ZEXT416(*(uint *)(lVar19 + lVar11)),auVar55);
        auVar75 = vshufps_avx(auVar71,auVar55,0xd8);
        auVar125._8_8_ = 0;
        auVar125._0_8_ = *(ulong *)(lVar19 + 0x1c + lVar11);
        auVar71 = vmovlhps_avx(ZEXT416(*(uint *)(lVar19 + 0x18 + lVar11)),auVar125);
        auVar70 = vshufps_avx(auVar71,auVar125,0xd8);
        fVar76 = *(float *)(lVar19 + 0x24 + lVar11);
        fVar147 = *(float *)(lVar19 + 0x28 + lVar11);
        fVar141 = *(float *)(lVar19 + 0x2c + lVar11);
        fVar144 = *(float *)(lVar19 + 0x30 + lVar11);
        fVar149 = fVar144 * fVar144 + fVar141 * fVar141 + fVar76 * fVar76 + fVar147 * fVar147;
        auVar71 = vrsqrtss_avx(ZEXT416((uint)fVar149),ZEXT416((uint)fVar149));
        fVar142 = auVar71._0_4_;
        fVar149 = fVar142 * 1.5 + fVar142 * fVar142 * fVar142 * fVar149 * -0.5;
        auVar70 = vinsertps_avx(auVar70,ZEXT416((uint)(fVar149 * fVar76)),0x30);
        auVar95 = vinsertps_avx(auVar75,ZEXT416((uint)(fVar149 * fVar147)),0x30);
        auVar71 = vinsertps_avx(ZEXT416(*(uint *)(lVar19 + 0xc + lVar11)),
                                ZEXT416(*(uint *)(lVar19 + 4 + lVar11)),0x10);
        auVar91 = vinsertps_avx(auVar92,ZEXT416((uint)(fVar149 * fVar144)),0x30);
        auVar92 = vinsertps_avx(auVar71,ZEXT416(*(uint *)(lVar19 + 0x3c + lVar11)),0x20);
        a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vinsertps_avx(auVar92,ZEXT416((uint)(fVar149 * fVar141)),0x30);
      }
      else if (iVar4 == 0x9244) {
        lVar19 = *plVar15;
        lVar11 = uVar10 * plVar15[2];
        auVar95 = *(undefined1 (*) [16])(lVar19 + lVar11);
        a0.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(lVar19 + 0x10 + lVar11);
        auVar91 = *(undefined1 (*) [16])(lVar19 + 0x20 + lVar11);
        auVar70 = *(undefined1 (*) [16])(lVar19 + 0x30 + lVar11);
      }
      auVar92 = vshufps_avx(auVar70,auVar70,0xff);
      auVar71 = vshufps_avx(auVar95,auVar95,0xff);
      auVar75 = vshufps_avx((undefined1  [16])a0.field_0,(undefined1  [16])a0.field_0,0xff);
      auVar74 = vshufps_avx(auVar91,auVar91,0xff);
      fVar138 = auVar71._0_4_;
      fVar131 = auVar92._0_4_;
      fVar113 = auVar75._0_4_;
      fVar151 = auVar74._0_4_;
      fVar76 = fVar138 * fVar113 + fVar151 * fVar131;
      fVar144 = fVar138 * fVar113 - fVar151 * fVar131;
      fVar149 = fVar131 * fVar131 - fVar138 * fVar138;
      fVar142 = fVar138 * fVar151 - fVar113 * fVar131;
      fVar147 = fVar138 * fVar151 + fVar113 * fVar131;
      fVar141 = fVar138 * fVar131 + fVar113 * fVar151;
      fVar150 = fVar113 * fVar151 - fVar138 * fVar131;
      auVar92 = ZEXT416((uint)(-fVar151 * fVar151 +
                              -fVar113 * fVar113 + fVar131 * fVar131 + fVar138 * fVar138));
      auVar92 = vshufps_avx(auVar92,auVar92,0);
      auVar71 = ZEXT416((uint)(fVar76 + fVar76));
      auVar71 = vshufps_avx(auVar71,auVar71,0);
      auVar75 = ZEXT416((uint)(fVar142 + fVar142));
      auVar75 = vshufps_avx(auVar75,auVar75,0);
      aVar119._0_4_ = auVar92._0_4_ * 1.0 + auVar71._0_4_ * 0.0 + auVar75._0_4_ * 0.0;
      aVar119._4_4_ = auVar92._4_4_ * 0.0 + auVar71._4_4_ * 1.0 + auVar75._4_4_ * 0.0;
      aVar119._8_4_ = auVar92._8_4_ * 0.0 + auVar71._8_4_ * 0.0 + auVar75._8_4_ * 1.0;
      aVar119._12_4_ = auVar92._12_4_ * 0.0 + auVar71._12_4_ * 0.0 + auVar75._12_4_ * 0.0;
      auVar92 = ZEXT416((uint)(-fVar151 * fVar151 + fVar113 * fVar113 + fVar149));
      auVar92 = vshufps_avx(auVar92,auVar92,0);
      auVar71 = ZEXT416((uint)(fVar141 + fVar141));
      auVar71 = vshufps_avx(auVar71,auVar71,0);
      auVar75 = ZEXT416((uint)(fVar144 + fVar144));
      auVar75 = vshufps_avx(auVar75,auVar75,0);
      b0.field_0._0_4_ = auVar75._0_4_ * 1.0 + auVar92._0_4_ * 0.0 + auVar71._0_4_ * 0.0;
      b0.field_0._4_4_ = auVar75._4_4_ * 0.0 + auVar92._4_4_ * 1.0 + auVar71._4_4_ * 0.0;
      b0.field_0._8_4_ = auVar75._8_4_ * 0.0 + auVar92._8_4_ * 0.0 + auVar71._8_4_ * 1.0;
      b0.field_0._12_4_ = auVar75._12_4_ * 0.0 + auVar92._12_4_ * 0.0 + auVar71._12_4_ * 0.0;
      auVar92 = ZEXT416((uint)(-fVar113 * fVar113 + fVar149 + fVar151 * fVar151));
      auVar71 = vshufps_avx(auVar92,auVar92,0);
      auVar92 = ZEXT416((uint)(fVar150 + fVar150));
      auVar75 = vshufps_avx(auVar92,auVar92,0);
      auVar92 = ZEXT416((uint)(fVar147 + fVar147));
      auVar74 = vshufps_avx(auVar92,auVar92,0);
      auVar92 = vshufps_avx(auVar95,ZEXT416(0) << 0x20,0xe9);
      auVar92 = vblendps_avx(auVar92,(undefined1  [16])a0.field_0,4);
      fVar76 = auVar74._0_4_ * 1.0 + auVar75._0_4_ * 0.0 + auVar71._0_4_ * 0.0;
      fVar147 = auVar74._4_4_ * 0.0 + auVar75._4_4_ * 1.0 + auVar71._4_4_ * 0.0;
      fVar141 = auVar74._8_4_ * 0.0 + auVar75._8_4_ * 0.0 + auVar71._8_4_ * 1.0;
      fVar144 = auVar74._12_4_ * 0.0 + auVar75._12_4_ * 0.0 + auVar71._12_4_ * 0.0;
      auVar74._0_4_ = auVar92._0_4_ + 0.0;
      auVar74._4_4_ = auVar92._4_4_ + 0.0;
      auVar74._8_4_ = auVar92._8_4_ + 0.0;
      auVar74._12_4_ = auVar92._12_4_ + 0.0;
      auVar71 = vshufps_avx(auVar95,auVar95,0);
      auVar99._0_4_ = fVar76 * 0.0;
      auVar99._4_4_ = fVar147 * 0.0;
      auVar99._8_4_ = fVar141 * 0.0;
      auVar99._12_4_ = fVar144 * 0.0;
      auVar92._0_4_ = auVar71._0_4_ * aVar119._0_4_ + auVar99._0_4_ + b0.field_0._0_4_ * 0.0;
      auVar92._4_4_ = auVar71._4_4_ * aVar119._4_4_ + auVar99._4_4_ + b0.field_0._4_4_ * 0.0;
      auVar92._8_4_ = auVar71._8_4_ * aVar119._8_4_ + auVar99._8_4_ + b0.field_0._8_4_ * 0.0;
      auVar92._12_4_ = auVar71._12_4_ * aVar119._12_4_ + auVar99._12_4_ + b0.field_0._12_4_ * 0.0;
      auVar71 = vshufps_avx((undefined1  [16])a0.field_0,(undefined1  [16])a0.field_0,0);
      auVar75 = vshufps_avx((undefined1  [16])a0.field_0,(undefined1  [16])a0.field_0,0x55);
      auVar160._0_4_ =
           auVar71._0_4_ * aVar119._0_4_ + auVar99._0_4_ + auVar75._0_4_ * b0.field_0._0_4_;
      auVar160._4_4_ =
           auVar71._4_4_ * aVar119._4_4_ + auVar99._4_4_ + auVar75._4_4_ * b0.field_0._4_4_;
      auVar160._8_4_ =
           auVar71._8_4_ * aVar119._8_4_ + auVar99._8_4_ + auVar75._8_4_ * b0.field_0._8_4_;
      auVar160._12_4_ =
           auVar71._12_4_ * aVar119._12_4_ + auVar99._12_4_ + auVar75._12_4_ * b0.field_0._12_4_;
      auVar71 = vshufps_avx(auVar91,auVar91,0x55);
      auVar161 = vshufps_avx(auVar91,auVar91,0xaa);
      auVar75._0_4_ = auVar161._0_4_ * fVar76;
      auVar75._4_4_ = auVar161._4_4_ * fVar147;
      auVar75._8_4_ = auVar161._8_4_ * fVar141;
      auVar75._12_4_ = auVar161._12_4_ * fVar144;
      a0.field_0._0_4_ = auVar71._0_4_ * b0.field_0._0_4_ + auVar75._0_4_;
      a0.field_0._4_4_ = auVar71._4_4_ * b0.field_0._4_4_ + auVar75._4_4_;
      a0.field_0._8_4_ = auVar71._8_4_ * b0.field_0._8_4_ + auVar75._8_4_;
      a0.field_0._12_4_ = auVar71._12_4_ * b0.field_0._12_4_ + auVar75._12_4_;
      auVar161 = vshufps_avx(auVar91,auVar91,0);
      auVar71._0_4_ = auVar161._0_4_ * aVar119._0_4_ + a0.field_0._0_4_;
      auVar71._4_4_ = auVar161._4_4_ * aVar119._4_4_ + a0.field_0._4_4_;
      auVar71._8_4_ = auVar161._8_4_ * aVar119._8_4_ + a0.field_0._8_4_;
      auVar71._12_4_ = auVar161._12_4_ * aVar119._12_4_ + a0.field_0._12_4_;
      auVar161 = vshufps_avx(auVar70,auVar70,0xaa);
      auVar95 = vshufps_avx(auVar70,auVar70,0x55);
      auVar91._0_4_ = auVar95._0_4_ * b0.field_0._0_4_;
      auVar91._4_4_ = auVar95._4_4_ * b0.field_0._4_4_;
      auVar91._8_4_ = auVar95._8_4_ * b0.field_0._8_4_;
      auVar91._12_4_ = auVar95._12_4_ * b0.field_0._12_4_;
      auVar95._0_4_ = auVar91._0_4_ + auVar161._0_4_ * fVar76;
      auVar95._4_4_ = auVar91._4_4_ + auVar161._4_4_ * fVar147;
      auVar95._8_4_ = auVar91._8_4_ + auVar161._8_4_ * fVar141;
      auVar95._12_4_ = auVar91._12_4_ + auVar161._12_4_ * fVar144;
      auVar161 = vshufps_avx(auVar70,auVar70,0);
      auVar70._0_4_ = auVar161._0_4_ * aVar119._0_4_ + auVar95._0_4_;
      auVar70._4_4_ = auVar161._4_4_ * aVar119._4_4_ + auVar95._4_4_;
      auVar70._8_4_ = auVar161._8_4_ * aVar119._8_4_ + auVar95._8_4_;
      auVar70._12_4_ = auVar161._12_4_ * aVar119._12_4_ + auVar95._12_4_;
      auVar161._0_4_ = auVar74._0_4_ + auVar70._0_4_;
      auVar161._4_4_ = auVar74._4_4_ + auVar70._4_4_;
      auVar161._8_4_ = auVar74._8_4_ + auVar70._8_4_;
      auVar161._12_4_ = auVar74._12_4_ + auVar70._12_4_;
    }
    else {
      aVar119 = a0_1.field_0;
      if (iVar4 < 0x9244) {
        if (iVar4 == 0x9134) {
          lVar19 = *plVar15;
          lVar11 = uVar10 * plVar15[2];
          uVar16 = *(uint *)(lVar19 + 4 + lVar11);
          auVar95 = ZEXT416(uVar16);
          uVar13 = *(uint *)(lVar19 + 8 + lVar11);
          auVar91 = ZEXT416(uVar13);
          uVar2 = *(uint *)(lVar19 + 0xc + lVar11);
          a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)ZEXT416(uVar2);
          auVar92 = vinsertps_avx(ZEXT416(*(uint *)(lVar19 + lVar11)),
                                  ZEXT416(*(uint *)(lVar19 + 0x10 + lVar11)),0x1c);
          auVar92 = vinsertps_avx(auVar92,ZEXT416(*(uint *)(lVar19 + 0x20 + lVar11)),0x28);
          auVar71 = vinsertps_avx(ZEXT416(uVar16),ZEXT416(*(uint *)(lVar19 + 0x14 + lVar11)),0x1c);
          auVar160 = vinsertps_avx(auVar71,ZEXT416(*(uint *)(lVar19 + 0x24 + lVar11)),0x28);
          auVar71 = vinsertps_avx(ZEXT416(uVar13),ZEXT416(*(uint *)(lVar19 + 0x18 + lVar11)),0x1c);
          auVar71 = vinsertps_avx(auVar71,ZEXT416(*(uint *)(lVar19 + 0x28 + lVar11)),0x28);
          auVar70 = vinsertps_avx(ZEXT416(uVar2),ZEXT416(*(uint *)(lVar19 + 0x1c + lVar11)),0x1c);
          auVar161 = vinsertps_avx(auVar70,ZEXT416(*(uint *)(lVar19 + 0x2c + lVar11)),0x28);
        }
        else if (iVar4 == 0x9234) {
          lVar19 = *plVar15;
          lVar11 = uVar10 * plVar15[2];
          auVar21._8_8_ = 0;
          auVar21._0_8_ = *(ulong *)(lVar19 + 4 + lVar11);
          auVar92 = vshufps_avx(ZEXT416(*(uint *)(lVar19 + lVar11)),auVar21,0x4c);
          auVar92 = vshufps_avx(auVar92,auVar92,0x78);
          auVar22._8_8_ = 0;
          auVar22._0_8_ = *(ulong *)(lVar19 + 0x10 + lVar11);
          auVar71 = vshufps_avx(ZEXT416(*(uint *)(lVar19 + 0xc + lVar11)),auVar22,0x4c);
          auVar160 = vshufps_avx(auVar71,auVar71,0x78);
          auVar23._8_8_ = 0;
          auVar23._0_8_ = *(ulong *)(lVar19 + 0x1c + lVar11);
          auVar71 = vshufps_avx(ZEXT416(*(uint *)(lVar19 + 0x18 + lVar11)),auVar23,0x4c);
          auVar71 = vshufps_avx(auVar71,auVar71,0x78);
          auVar24._8_8_ = 0;
          auVar24._0_8_ = *(ulong *)(lVar19 + 0x28 + lVar11);
          uVar16 = *(uint *)(lVar19 + 0x24 + lVar11);
          auVar95 = ZEXT416(uVar16);
          auVar70 = vshufps_avx(ZEXT416(uVar16),auVar24,0x4c);
          auVar161 = vshufps_avx(auVar70,auVar70,0x78);
        }
      }
      else if (iVar4 == 0xb001) {
        lVar19 = *plVar15;
        lVar11 = uVar10 * plVar15[2];
        auVar26._8_8_ = 0;
        auVar26._0_8_ = *(ulong *)(lVar19 + 0x10 + lVar11);
        auVar71 = vinsertps_avx(auVar26,ZEXT416(*(uint *)(lVar19 + 8 + lVar11)),0x20);
        auVar78._8_8_ = 0;
        auVar78._0_8_ = *(ulong *)(lVar19 + 0x34 + lVar11);
        auVar92 = vmovlhps_avx(ZEXT416(*(uint *)(lVar19 + lVar11)),auVar78);
        auVar70 = vshufps_avx(auVar92,auVar78,0xd8);
        auVar114._8_8_ = 0;
        auVar114._0_8_ = *(ulong *)(lVar19 + 0x1c + lVar11);
        auVar92 = vmovlhps_avx(ZEXT416(*(uint *)(lVar19 + 0x18 + lVar11)),auVar114);
        auVar160 = vshufps_avx(auVar92,auVar114,0xd8);
        fVar76 = *(float *)(lVar19 + 0x24 + lVar11);
        fVar147 = *(float *)(lVar19 + 0x28 + lVar11);
        b0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)ZEXT416((uint)fVar147);
        fVar141 = *(float *)(lVar19 + 0x2c + lVar11);
        auVar74 = ZEXT416((uint)fVar141);
        fVar144 = *(float *)(lVar19 + 0x30 + lVar11);
        auVar75 = ZEXT416((uint)fVar144);
        fVar149 = fVar144 * fVar144 + fVar141 * fVar141 + fVar76 * fVar76 + fVar147 * fVar147;
        auVar92 = vrsqrtss_avx(ZEXT416((uint)fVar149),ZEXT416((uint)fVar149));
        fVar142 = auVar92._0_4_;
        auVar99 = ZEXT416((uint)(fVar142 * fVar142));
        fVar149 = fVar142 * 1.5 + fVar142 * fVar142 * fVar142 * fVar149 * -0.5;
        aVar119 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)ZEXT416((uint)(fVar149 * fVar76));
        auVar161 = vinsertps_avx(auVar160,ZEXT416((uint)(fVar149 * fVar76)),0x30);
        auVar92 = vinsertps_avx(auVar70,ZEXT416((uint)(fVar149 * fVar147)),0x30);
        auVar95 = ZEXT416((uint)(fVar149 * fVar141));
        auVar91 = ZEXT416((uint)(fVar149 * fVar144));
        a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vinsertps_avx(ZEXT416(*(uint *)(lVar19 + 0xc + lVar11)),
                                   ZEXT416(*(uint *)(lVar19 + 4 + lVar11)),0x10);
        auVar71 = vinsertps_avx(auVar71,ZEXT416((uint)(fVar149 * fVar144)),0x30);
        auVar70 = vinsertps_avx((undefined1  [16])a0.field_0,
                                ZEXT416(*(uint *)(lVar19 + 0x3c + lVar11)),0x20);
        auVar160 = vinsertps_avx(auVar70,ZEXT416((uint)(fVar149 * fVar141)),0x30);
      }
      else if (iVar4 == 0x9244) {
        lVar19 = *plVar15;
        lVar11 = uVar10 * plVar15[2];
        auVar92 = *(undefined1 (*) [16])(lVar19 + lVar11);
        auVar160 = *(undefined1 (*) [16])(lVar19 + 0x10 + lVar11);
        auVar71 = *(undefined1 (*) [16])(lVar19 + 0x20 + lVar11);
        auVar161 = *(undefined1 (*) [16])(lVar19 + 0x30 + lVar11);
      }
    }
  }
  else {
    fVar76 = (pGVar5->time_range).lower;
    fVar147 = (pGVar5->time_range).upper;
    a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)ZEXT416((uint)fVar147);
    fVar76 = pGVar5->fnumTimeSegments * ((query->time - fVar76) / (fVar147 - fVar76));
    auVar71 = ZEXT416((uint)fVar76);
    auVar92 = vroundss_avx(ZEXT416((uint)fVar76),ZEXT416((uint)fVar76),9);
    auVar70 = vminss_avx(auVar92,ZEXT416((uint)(pGVar5->fnumTimeSegments + -1.0)));
    auVar92 = ZEXT816(0) << 0x20;
    auVar91 = SUB6416(ZEXT864(0),0) << 0x20;
    auVar70 = vmaxss_avx(auVar92,auVar70);
    iVar12 = (int)auVar70._0_4_;
    fVar76 = fVar76 - auVar70._0_4_;
    lVar19 = *(long *)&pGVar5[1].fnumTimeSegments;
    lVar11 = CONCAT44((int)((ulong)pRVar14 >> 0x20),iVar12) * 0x38;
    plVar15 = (long *)(lVar19 + lVar11);
    iVar4 = *(int *)(lVar19 + 0x20 + lVar11);
    auVar95 = ZEXT416((uint)fVar76);
    if ((pGVar5->field_8).field_0x1 == '\x01') {
      auVar71 = auVar95;
      if (iVar4 < 0x9244) {
        if (iVar4 == 0x9134) {
          lVar11 = *plVar15;
          lVar18 = plVar15[2] * uVar10;
          uVar16 = *(uint *)(lVar11 + 8 + lVar18);
          auVar92 = ZEXT416(uVar16);
          auVar71 = vinsertps_avx(ZEXT416(*(uint *)(lVar11 + lVar18)),
                                  ZEXT416(*(uint *)(lVar11 + 0x10 + lVar18)),0x1c);
          auVar160 = vinsertps_avx(auVar71,ZEXT416(*(uint *)(lVar11 + 0x20 + lVar18)),0x28);
          auVar71 = vinsertps_avx(ZEXT416(*(uint *)(lVar11 + 4 + lVar18)),
                                  ZEXT416(*(uint *)(lVar11 + 0x14 + lVar18)),0x1c);
          auVar71 = vinsertps_avx(auVar71,ZEXT416(*(uint *)(lVar11 + 0x24 + lVar18)),0x28);
          auVar70 = vinsertps_avx(ZEXT416(uVar16),ZEXT416(*(uint *)(lVar11 + 0x18 + lVar18)),0x1c);
          _local_268 = vinsertps_avx(auVar70,ZEXT416(*(uint *)(lVar11 + 0x28 + lVar18)),0x28);
          auVar70 = vinsertps_avx(ZEXT416(*(uint *)(lVar11 + 0xc + lVar18)),
                                  ZEXT416(*(uint *)(lVar11 + 0x1c + lVar18)),0x1c);
          auVar161 = vinsertps_avx(auVar70,ZEXT416(*(uint *)(lVar11 + 0x2c + lVar18)),0x28);
        }
        else if (iVar4 == 0x9234) {
          lVar11 = *plVar15;
          lVar18 = plVar15[2] * uVar10;
          auVar42._8_8_ = 0;
          auVar42._0_8_ = *(ulong *)(lVar11 + 4 + lVar18);
          auVar71 = vshufps_avx(ZEXT416(*(uint *)(lVar11 + lVar18)),auVar42,0x4c);
          auVar160 = vshufps_avx(auVar71,auVar71,0x78);
          auVar43._8_8_ = 0;
          auVar43._0_8_ = *(ulong *)(lVar11 + 0x10 + lVar18);
          auVar71 = vshufps_avx(ZEXT416(*(uint *)(lVar11 + 0xc + lVar18)),auVar43,0x4c);
          auVar71 = vshufps_avx(auVar71,auVar71,0x78);
          auVar44._8_8_ = 0;
          auVar44._0_8_ = *(ulong *)(lVar11 + 0x1c + lVar18);
          auVar70 = vshufps_avx(ZEXT416(*(uint *)(lVar11 + 0x18 + lVar18)),auVar44,0x4c);
          _local_268 = vshufps_avx(auVar70,auVar70,0x78);
          auVar45._8_8_ = 0;
          auVar45._0_8_ = *(ulong *)(lVar11 + 0x28 + lVar18);
          auVar70 = vshufps_avx(ZEXT416(*(uint *)(lVar11 + 0x24 + lVar18)),auVar45,0x4c);
          auVar161 = vshufps_avx(auVar70,auVar70,0x78);
        }
      }
      else if (iVar4 == 0xb001) {
        lVar11 = *plVar15;
        lVar18 = plVar15[2] * uVar10;
        auVar56._8_8_ = 0;
        auVar56._0_8_ = *(ulong *)(lVar11 + 0x10 + lVar18);
        auVar71 = vinsertps_avx(auVar56,ZEXT416(*(uint *)(lVar11 + 8 + lVar18)),0x20);
        auVar85._8_8_ = 0;
        auVar85._0_8_ = *(ulong *)(lVar11 + 0x34 + lVar18);
        auVar92 = vmovlhps_avx(ZEXT416(*(uint *)(lVar11 + lVar18)),auVar85);
        auVar70 = vshufps_avx(auVar92,auVar85,0xd8);
        auVar126._8_8_ = 0;
        auVar126._0_8_ = *(ulong *)(lVar11 + 0x1c + lVar18);
        auVar92 = vmovlhps_avx(ZEXT416(*(uint *)(lVar11 + 0x18 + lVar18)),auVar126);
        auVar75 = vshufps_avx(auVar92,auVar126,0xd8);
        fVar147 = *(float *)(lVar11 + 0x24 + lVar18);
        fVar141 = *(float *)(lVar11 + 0x28 + lVar18);
        b0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)ZEXT416((uint)fVar141);
        fVar144 = *(float *)(lVar11 + 0x2c + lVar18);
        fVar149 = *(float *)(lVar11 + 0x30 + lVar18);
        fVar142 = fVar149 * fVar149 + fVar144 * fVar144 + fVar147 * fVar147 + fVar141 * fVar141;
        auVar92 = vrsqrtss_avx(ZEXT416((uint)fVar142),ZEXT416((uint)fVar142));
        fVar150 = auVar92._0_4_;
        auVar99 = ZEXT416((uint)(fVar150 * fVar150));
        fVar142 = fVar150 * 1.5 + fVar150 * fVar150 * fVar150 * fVar142 * -0.5;
        a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       ZEXT416((uint)(fVar142 * fVar147));
        auVar161 = vinsertps_avx(auVar75,ZEXT416((uint)(fVar142 * fVar147)),0x30);
        auVar160 = vinsertps_avx(auVar70,ZEXT416((uint)(fVar142 * fVar141)),0x30);
        auVar92 = ZEXT416((uint)(fVar142 * fVar149));
        auVar70 = vinsertps_avx(ZEXT416(*(uint *)(lVar11 + 0xc + lVar18)),
                                ZEXT416(*(uint *)(lVar11 + 4 + lVar18)),0x10);
        _local_268 = vinsertps_avx(auVar71,ZEXT416((uint)(fVar142 * fVar149)),0x30);
        auVar71 = vinsertps_avx(auVar70,ZEXT416(*(uint *)(lVar11 + 0x3c + lVar18)),0x20);
        auVar71 = vinsertps_avx(auVar71,ZEXT416((uint)(fVar142 * fVar144)),0x30);
      }
      else if (iVar4 == 0x9244) {
        lVar11 = *plVar15;
        lVar18 = plVar15[2] * uVar10;
        auVar160 = *(undefined1 (*) [16])(lVar11 + lVar18);
        auVar71 = *(undefined1 (*) [16])(lVar11 + 0x10 + lVar18);
        _local_268 = *(undefined1 (*) [16])(lVar11 + 0x20 + lVar18);
        auVar161 = *(undefined1 (*) [16])(lVar11 + 0x30 + lVar18);
      }
      lVar11 = (ulong)(iVar12 + 1) * 0x38;
      plVar15 = (long *)(lVar19 + lVar11);
      iVar4 = *(int *)(lVar19 + 0x20 + lVar11);
      if (iVar4 < 0x9244) {
        if (iVar4 == 0x9134) {
          lVar19 = *plVar15;
          lVar11 = uVar10 * plVar15[2];
          auVar92 = vinsertps_avx(ZEXT416(*(uint *)(lVar19 + lVar11)),
                                  ZEXT416(*(uint *)(lVar19 + 0x10 + lVar11)),0x1c);
          a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                         vinsertps_avx(auVar92,ZEXT416(*(uint *)(lVar19 + 0x20 + lVar11)),0x28);
          auVar92 = vinsertps_avx(ZEXT416(*(uint *)(lVar19 + 4 + lVar11)),
                                  ZEXT416(*(uint *)(lVar19 + 0x14 + lVar11)),0x1c);
          b0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vinsertps_avx(auVar92,ZEXT416(*(uint *)(lVar19 + 0x24 + lVar11)),0x28);
          auVar92 = vinsertps_avx(ZEXT416(*(uint *)(lVar19 + 8 + lVar11)),
                                  ZEXT416(*(uint *)(lVar19 + 0x18 + lVar11)),0x1c);
          auVar92 = vinsertps_avx(auVar92,ZEXT416(*(uint *)(lVar19 + 0x28 + lVar11)),0x28);
          auVar70 = vinsertps_avx(ZEXT416(*(uint *)(lVar19 + 0xc + lVar11)),
                                  ZEXT416(*(uint *)(lVar19 + 0x1c + lVar11)),0x1c);
          auVar99 = vinsertps_avx(auVar70,ZEXT416(*(uint *)(lVar19 + 0x2c + lVar11)),0x28);
        }
        else if (iVar4 == 0x9234) {
          lVar19 = *plVar15;
          lVar11 = uVar10 * plVar15[2];
          auVar57._8_8_ = 0;
          auVar57._0_8_ = *(ulong *)(lVar19 + 4 + lVar11);
          auVar92 = vshufps_avx(ZEXT416(*(uint *)(lVar19 + lVar11)),auVar57,0x4c);
          a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                         vshufps_avx(auVar92,auVar92,0x78);
          auVar58._8_8_ = 0;
          auVar58._0_8_ = *(ulong *)(lVar19 + 0x10 + lVar11);
          auVar92 = vshufps_avx(ZEXT416(*(uint *)(lVar19 + 0xc + lVar11)),auVar58,0x4c);
          b0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vshufps_avx(auVar92,auVar92,0x78);
          auVar59._8_8_ = 0;
          auVar59._0_8_ = *(ulong *)(lVar19 + 0x1c + lVar11);
          auVar92 = vshufps_avx(ZEXT416(*(uint *)(lVar19 + 0x18 + lVar11)),auVar59,0x4c);
          auVar92 = vshufps_avx(auVar92,auVar92,0x78);
          auVar60._8_8_ = 0;
          auVar60._0_8_ = *(ulong *)(lVar19 + 0x28 + lVar11);
          auVar70 = vshufps_avx(ZEXT416(*(uint *)(lVar19 + 0x24 + lVar11)),auVar60,0x4c);
          auVar99 = vshufps_avx(auVar70,auVar70,0x78);
        }
      }
      else if (iVar4 == 0xb001) {
        lVar19 = *plVar15;
        lVar11 = uVar10 * plVar15[2];
        auVar68._8_8_ = 0;
        auVar68._0_8_ = *(ulong *)(lVar19 + 0x10 + lVar11);
        auVar92 = vinsertps_avx(auVar68,ZEXT416(*(uint *)(lVar19 + 8 + lVar11)),0x20);
        auVar87._8_8_ = 0;
        auVar87._0_8_ = *(ulong *)(lVar19 + 0x34 + lVar11);
        auVar70 = vmovlhps_avx(ZEXT416(*(uint *)(lVar19 + lVar11)),auVar87);
        auVar75 = vshufps_avx(auVar70,auVar87,0xd8);
        auVar129._8_8_ = 0;
        auVar129._0_8_ = *(ulong *)(lVar19 + 0x1c + lVar11);
        auVar70 = vmovlhps_avx(ZEXT416(*(uint *)(lVar19 + 0x18 + lVar11)),auVar129);
        auVar74 = vshufps_avx(auVar70,auVar129,0xd8);
        fVar147 = *(float *)(lVar19 + 0x24 + lVar11);
        fVar141 = *(float *)(lVar19 + 0x28 + lVar11);
        fVar144 = *(float *)(lVar19 + 0x2c + lVar11);
        fVar149 = *(float *)(lVar19 + 0x30 + lVar11);
        fVar142 = fVar149 * fVar149 + fVar144 * fVar144 + fVar147 * fVar147 + fVar141 * fVar141;
        auVar70 = vrsqrtss_avx(ZEXT416((uint)fVar142),ZEXT416((uint)fVar142));
        fVar150 = auVar70._0_4_;
        fVar142 = fVar150 * 1.5 + fVar150 * fVar150 * fVar150 * fVar142 * -0.5;
        auVar99 = vinsertps_avx(auVar74,ZEXT416((uint)(fVar142 * fVar147)),0x30);
        a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vinsertps_avx(auVar75,ZEXT416((uint)(fVar142 * fVar141)),0x30);
        auVar70 = vinsertps_avx(ZEXT416(*(uint *)(lVar19 + 0xc + lVar11)),
                                ZEXT416(*(uint *)(lVar19 + 4 + lVar11)),0x10);
        auVar92 = vinsertps_avx(auVar92,ZEXT416((uint)(fVar142 * fVar149)),0x30);
        auVar70 = vinsertps_avx(auVar70,ZEXT416(*(uint *)(lVar19 + 0x3c + lVar11)),0x20);
        b0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vinsertps_avx(auVar70,ZEXT416((uint)(fVar142 * fVar144)),0x30);
      }
      else if (iVar4 == 0x9244) {
        lVar19 = *plVar15;
        lVar11 = uVar10 * plVar15[2];
        a0_1.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                        ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(lVar19 + lVar11))->v;
        b0.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                      ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(lVar19 + 0x10 + lVar11))->v
        ;
        auVar92 = *(undefined1 (*) [16])(lVar19 + 0x20 + lVar11);
        auVar99 = *(undefined1 (*) [16])(lVar19 + 0x30 + lVar11);
      }
      auVar70 = vshufps_avx(auVar161,auVar161,0xff);
      auVar75 = vshufps_avx(auVar160,auVar160,0xff);
      auVar74 = vshufps_avx(auVar71,auVar71,0xff);
      auVar42 = vpermilps_avx(_local_268,0xff);
      auVar91 = vshufps_avx(auVar99,auVar99,0xff);
      auVar56 = vshufps_avx((undefined1  [16])a0_1.field_0,(undefined1  [16])a0_1.field_0,0xff);
      auVar85 = vshufps_avx((undefined1  [16])b0.field_0,(undefined1  [16])b0.field_0,0xff);
      auVar126 = vshufps_avx(auVar92,auVar92,0xff);
      fVar149 = auVar75._0_4_;
      fVar142 = auVar70._0_4_;
      fVar144 = auVar74._0_4_;
      fVar141 = auVar42._0_4_;
      fVar147 = fVar141 * auVar126._0_4_ +
                auVar85._0_4_ * fVar144 + fVar142 * auVar91._0_4_ + auVar56._0_4_ * fVar149;
      auVar154._0_4_ = -fVar147;
      auVar154._4_4_ = 0x80000000;
      auVar154._8_4_ = 0x80000000;
      auVar154._12_4_ = 0x80000000;
      auVar100._0_8_ = auVar126._0_8_ ^ 0x8000000080000000;
      auVar100._8_4_ = auVar126._8_4_ ^ 0x80000000;
      auVar100._12_4_ = auVar126._12_4_ ^ 0x80000000;
      if (fVar147 < auVar154._0_4_) {
        auVar163._0_8_ = auVar91._0_8_ ^ 0x8000000080000000;
        auVar163._8_4_ = auVar91._8_4_ ^ 0x80000000;
        auVar163._12_4_ = auVar91._12_4_ ^ 0x80000000;
        auVar158._0_8_ = auVar56._0_8_ ^ 0x8000000080000000;
        auVar158._8_4_ = auVar56._8_4_ ^ 0x80000000;
        auVar158._12_4_ = auVar56._12_4_ ^ 0x80000000;
        auVar126 = auVar100;
        auVar91 = auVar163;
        auVar56 = auVar158;
      }
      auVar69._8_4_ = 0x7fffffff;
      auVar69._0_8_ = 0x7fffffff7fffffff;
      auVar69._12_4_ = 0x7fffffff;
      auVar70 = vandps_avx(ZEXT416((uint)fVar147),auVar69);
      fVar113 = auVar70._0_4_;
      auVar75 = vmaxss_avx(auVar154,ZEXT416((uint)fVar147));
      fVar150 = 1.0 - fVar113;
      fVar151 = auVar75._0_4_;
      if (fVar150 < 0.0) {
        fVar150 = sqrtf(fVar150);
        auVar75 = ZEXT416((uint)fVar151);
      }
      else {
        auVar74 = vsqrtss_avx(ZEXT416((uint)fVar150),ZEXT416((uint)fVar150));
        fVar150 = auVar74._0_4_;
      }
      auVar42 = vmaxss_avx(ZEXT816(0) << 0x40,
                           ZEXT416((uint)(1.5707964 -
                                         fVar150 * (fVar113 * (fVar113 * (fVar113 * (fVar113 * (
                                                  fVar113 * -0.0043095737 + 0.0192803) + -0.04489909
                                                  ) + 0.08785567) + -0.21450998) + 1.5707952))));
      auVar101._0_8_ = auVar42._0_8_ ^ 0x8000000080000000;
      auVar101._8_4_ = auVar42._8_4_ ^ 0x80000000;
      auVar101._12_4_ = auVar42._12_4_ ^ 0x80000000;
      auVar74 = vcmpss_avx(auVar75,ZEXT816(0) << 0x40,1);
      auVar74 = vblendvps_avx(auVar42,auVar101,auVar74);
      auVar70 = vcmpss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar70,1);
      auVar108._8_4_ = 0x7fc00000;
      auVar108._0_8_ = 0x7fc000007fc00000;
      auVar108._12_4_ = 0x7fc00000;
      auVar70 = vblendvps_avx(ZEXT416((uint)(1.5707964 - auVar74._0_4_)),auVar108,auVar70);
      fVar113 = fVar76 * auVar70._0_4_;
      auVar70 = ZEXT416((uint)(fVar113 * 0.63661975));
      auVar70 = vroundss_avx(auVar70,auVar70,9);
      uVar16 = (uint)auVar70._0_4_;
      fVar113 = fVar113 - auVar70._0_4_ * 1.5707964;
      fVar150 = fVar113 * fVar113;
      auVar109._0_8_ = auVar85._0_8_ ^ 0x8000000080000000;
      auVar109._8_4_ = auVar85._8_4_ ^ 0x80000000;
      auVar109._12_4_ = auVar85._12_4_ ^ 0x80000000;
      auVar70 = vcmpss_avx(ZEXT416((uint)fVar147),ZEXT416((uint)auVar154._0_4_),1);
      uVar13 = uVar16 & 3;
      plVar15 = (long *)0x0;
      fVar147 = fVar150 * (fVar150 * (fVar150 * (fVar150 * (fVar150 * -2.5963018e-07 + 2.4756235e-05
                                                           ) + -0.001388833) + 0.04166664) + -0.5) +
                1.0;
      fVar113 = fVar113 * (fVar150 * (fVar150 * (fVar150 * (fVar150 * (fVar150 * -2.5029328e-08 +
                                                                      2.7600126e-06) +
                                                           -0.00019842605) + 0.008333348) +
                                     -0.16666667) + 1.0);
      fVar150 = fVar147;
      if ((uVar16 & 1) != 0) {
        fVar150 = fVar113;
        fVar113 = fVar147;
      }
      auVar70 = vblendvps_avx(auVar85,auVar109,auVar70);
      if (1 < uVar13) {
        fVar113 = -fVar113;
      }
      if (uVar13 - 1 < 2) {
        fVar150 = -fVar150;
      }
      fVar147 = auVar75._0_4_;
      local_118 = auVar91._0_4_;
      fVar140 = fVar147 * fVar142 - local_118;
      local_108 = auVar56._0_4_;
      fVar145 = fVar147 * fVar149 - local_108;
      fVar146 = fVar147 * fVar144 - auVar70._0_4_;
      local_128 = auVar126._0_4_;
      fVar7 = fVar147 * fVar141 - local_128;
      fVar147 = fVar7 * fVar7 + fVar146 * fVar146 + fVar140 * fVar140 + fVar145 * fVar145;
      auVar75 = vrsqrtss_avx(ZEXT416((uint)fVar147),ZEXT416((uint)fVar147));
      fVar131 = auVar75._0_4_;
      fVar147 = fVar131 * 1.5 + fVar131 * fVar131 * fVar131 * fVar147 * -0.5;
      fVar8 = 1.0 - fVar76;
      fVar131 = fVar142 * fVar8 + local_118 * fVar76;
      fVar138 = fVar8 * fVar149 + fVar76 * local_108;
      fVar156 = fVar8 * fVar144 + auVar70._0_4_ * fVar76;
      fVar76 = fVar141 * fVar8 + local_128 * fVar76;
      fVar139 = fVar76 * fVar76 + fVar156 * fVar156 + fVar131 * fVar131 + fVar138 * fVar138;
      auVar70 = vrsqrtss_avx(ZEXT416((uint)fVar139),ZEXT416((uint)fVar139));
      fVar162 = auVar70._0_4_;
      fVar139 = fVar162 * 1.5 + fVar162 * fVar162 * fVar162 * fVar139 * -0.5;
      auVar70 = vcmpss_avx(SUB6416(ZEXT464(0x3f7fdf3b),0),ZEXT416((uint)fVar151),1);
      auVar70 = vblendvps_avx(ZEXT416((uint)(fVar142 * fVar150 - fVar147 * fVar140 * fVar113)),
                              ZEXT416((uint)(fVar131 * fVar139)),auVar70);
      if (0.9995 < fVar151) {
        fVar138 = fVar138 * fVar139;
        fVar156 = fVar156 * fVar139;
        fVar76 = fVar76 * fVar139;
      }
      else {
        fVar138 = fVar150 * fVar149 - fVar147 * fVar145 * fVar113;
        fVar156 = fVar144 * fVar150 - fVar147 * fVar146 * fVar113;
        fVar76 = fVar150 * fVar141 - fVar147 * fVar7 * fVar113;
      }
      local_228 = auVar71._0_4_;
      fStack_224 = auVar71._4_4_;
      fStack_220 = auVar71._8_4_;
      fStack_21c = auVar71._12_4_;
      local_208 = auVar161._0_4_;
      fStack_204 = auVar161._4_4_;
      fStack_200 = auVar161._8_4_;
      fStack_1fc = auVar161._12_4_;
      auVar71 = vpermilps_avx(auVar95,0);
      local_1d8 = a0_1.field_0._0_4_;
      fStack_1d4 = a0_1.field_0._4_4_;
      fStack_1d0 = a0_1.field_0._8_4_;
      fStack_1cc = a0_1.field_0._12_4_;
      fVar147 = auVar71._0_4_;
      fVar141 = auVar71._4_4_;
      fVar144 = auVar71._8_4_;
      fVar149 = auVar71._12_4_;
      auVar71 = vshufps_avx(ZEXT416((uint)fVar8),ZEXT416((uint)fVar8),0);
      local_1f8 = auVar160._0_4_;
      fStack_1f4 = auVar160._4_4_;
      fStack_1f0 = auVar160._8_4_;
      fStack_1ec = auVar160._12_4_;
      fVar142 = auVar71._0_4_;
      fVar150 = auVar71._4_4_;
      fVar113 = auVar71._8_4_;
      fVar151 = auVar71._12_4_;
      local_258._4_4_ = fVar150 * fStack_1f4 + fVar141 * fStack_1d4;
      local_258._0_4_ = fVar142 * local_1f8 + fVar147 * local_1d8;
      fStack_250 = fVar113 * fStack_1f0 + fVar144 * fStack_1d0;
      fStack_24c = fVar151 * fStack_1ec + fVar149 * fStack_1cc;
      local_d8 = b0.field_0._0_4_;
      fStack_d4 = b0.field_0._4_4_;
      fStack_d0 = b0.field_0._8_4_;
      fStack_cc = b0.field_0._12_4_;
      auVar102._0_4_ = fVar142 * local_228 + fVar147 * local_d8;
      auVar102._4_4_ = fVar150 * fStack_224 + fVar141 * fStack_d4;
      auVar102._8_4_ = fVar113 * fStack_220 + fVar144 * fStack_d0;
      auVar102._12_4_ = fVar151 * fStack_21c + fVar149 * fStack_cc;
      local_178 = auVar92._0_4_;
      fStack_174 = auVar92._4_4_;
      fStack_170 = auVar92._8_4_;
      fStack_16c = auVar92._12_4_;
      auVar88._0_4_ = (float)local_268._0_4_ * fVar142 + fVar147 * local_178;
      auVar88._4_4_ = (float)local_268._4_4_ * fVar150 + fVar141 * fStack_174;
      auVar88._8_4_ = fStack_260 * fVar113 + fVar144 * fStack_170;
      auVar88._12_4_ = fStack_25c * fVar151 + fVar149 * fStack_16c;
      local_168 = auVar99._0_4_;
      fStack_164 = auVar99._4_4_;
      fStack_160 = auVar99._8_4_;
      fStack_15c = auVar99._12_4_;
      a0.field_0._0_4_ = local_208 * fVar142 + fVar147 * local_168;
      a0.field_0._4_4_ = fStack_204 * fVar150 + fVar141 * fStack_164;
      a0.field_0._8_4_ = fStack_200 * fVar113 + fVar144 * fStack_160;
      a0.field_0._12_4_ = fStack_1fc * fVar151 + fVar149 * fStack_15c;
      fVar151 = auVar70._0_4_;
      fVar147 = fVar156 * fVar138 + fVar151 * fVar76;
      fVar149 = fVar156 * fVar138 - fVar151 * fVar76;
      fVar142 = fVar151 * fVar151 - fVar138 * fVar138;
      fVar150 = fVar138 * fVar76 - fVar156 * fVar151;
      fVar141 = fVar138 * fVar76 + fVar156 * fVar151;
      fVar144 = fVar156 * fVar76 + fVar151 * fVar138;
      fVar113 = fVar156 * fVar76 - fVar151 * fVar138;
      auVar92 = ZEXT416((uint)(-fVar76 * fVar76 +
                              -fVar156 * fVar156 + fVar151 * fVar151 + fVar138 * fVar138));
      auVar92 = vshufps_avx(auVar92,auVar92,0);
      auVar71 = ZEXT416((uint)(fVar147 + fVar147));
      auVar71 = vshufps_avx(auVar71,auVar71,0);
      auVar70 = ZEXT416((uint)(fVar150 + fVar150));
      auVar70 = vshufps_avx(auVar70,auVar70,0);
      aVar119._0_4_ = auVar92._0_4_ * 1.0 + auVar71._0_4_ * 0.0 + auVar70._0_4_ * 0.0;
      aVar119._4_4_ = auVar92._4_4_ * 0.0 + auVar71._4_4_ * 1.0 + auVar70._4_4_ * 0.0;
      aVar119._8_4_ = auVar92._8_4_ * 0.0 + auVar71._8_4_ * 0.0 + auVar70._8_4_ * 1.0;
      aVar119._12_4_ = auVar92._12_4_ * 0.0 + auVar71._12_4_ * 0.0 + auVar70._12_4_ * 0.0;
      auVar92 = ZEXT416((uint)(-fVar76 * fVar76 + fVar156 * fVar156 + fVar142));
      auVar92 = vshufps_avx(auVar92,auVar92,0);
      auVar71 = ZEXT416((uint)(fVar144 + fVar144));
      auVar71 = vshufps_avx(auVar71,auVar71,0);
      auVar70 = ZEXT416((uint)(fVar149 + fVar149));
      auVar70 = vshufps_avx(auVar70,auVar70,0);
      b0.field_0._0_4_ = auVar70._0_4_ * 1.0 + auVar71._0_4_ * 0.0 + auVar92._0_4_ * 0.0;
      b0.field_0._4_4_ = auVar70._4_4_ * 0.0 + auVar71._4_4_ * 0.0 + auVar92._4_4_ * 1.0;
      b0.field_0._8_4_ = auVar70._8_4_ * 0.0 + auVar71._8_4_ * 1.0 + auVar92._8_4_ * 0.0;
      b0.field_0._12_4_ = auVar70._12_4_ * 0.0 + auVar71._12_4_ * 0.0 + auVar92._12_4_ * 0.0;
      auVar92 = ZEXT416((uint)(-fVar156 * fVar156 + fVar142 + fVar76 * fVar76));
      auVar71 = vshufps_avx(auVar92,auVar92,0);
      auVar92 = ZEXT416((uint)(fVar113 + fVar113));
      auVar70 = vshufps_avx(auVar92,auVar92,0);
      auVar92 = ZEXT416((uint)(fVar141 + fVar141));
      auVar75 = vshufps_avx(auVar92,auVar92,0);
      auVar92 = vshufps_avx(_local_258,ZEXT416(0) << 0x20,0xe9);
      auVar92 = vblendps_avx(auVar92,auVar102,4);
      fVar76 = auVar75._0_4_ * 1.0 + auVar70._0_4_ * 0.0 + auVar71._0_4_ * 0.0;
      fVar147 = auVar75._4_4_ * 0.0 + auVar70._4_4_ * 1.0 + auVar71._4_4_ * 0.0;
      fVar141 = auVar75._8_4_ * 0.0 + auVar70._8_4_ * 0.0 + auVar71._8_4_ * 1.0;
      fVar144 = auVar75._12_4_ * 0.0 + auVar70._12_4_ * 0.0 + auVar71._12_4_ * 0.0;
      auVar75._0_4_ = auVar92._0_4_ + 0.0;
      auVar75._4_4_ = auVar92._4_4_ + 0.0;
      auVar75._8_4_ = auVar92._8_4_ + 0.0;
      auVar75._12_4_ = auVar92._12_4_ + 0.0;
      auVar71 = vshufps_avx(_local_258,_local_258,0);
      auVar99._0_4_ = fVar76 * 0.0;
      auVar99._4_4_ = fVar147 * 0.0;
      auVar99._8_4_ = fVar141 * 0.0;
      auVar99._12_4_ = fVar144 * 0.0;
      auVar92._0_4_ = auVar71._0_4_ * aVar119._0_4_ + auVar99._0_4_ + b0.field_0._0_4_ * 0.0;
      auVar92._4_4_ = auVar71._4_4_ * aVar119._4_4_ + auVar99._4_4_ + b0.field_0._4_4_ * 0.0;
      auVar92._8_4_ = auVar71._8_4_ * aVar119._8_4_ + auVar99._8_4_ + b0.field_0._8_4_ * 0.0;
      auVar92._12_4_ = auVar71._12_4_ * aVar119._12_4_ + auVar99._12_4_ + b0.field_0._12_4_ * 0.0;
      auVar71 = vshufps_avx(auVar102,auVar102,0);
      auVar70 = vshufps_avx(auVar102,auVar102,0x55);
      auVar160._0_4_ =
           auVar71._0_4_ * aVar119._0_4_ + auVar99._0_4_ + auVar70._0_4_ * b0.field_0._0_4_;
      auVar160._4_4_ =
           auVar71._4_4_ * aVar119._4_4_ + auVar99._4_4_ + auVar70._4_4_ * b0.field_0._4_4_;
      auVar160._8_4_ =
           auVar71._8_4_ * aVar119._8_4_ + auVar99._8_4_ + auVar70._8_4_ * b0.field_0._8_4_;
      auVar160._12_4_ =
           auVar71._12_4_ * aVar119._12_4_ + auVar99._12_4_ + auVar70._12_4_ * b0.field_0._12_4_;
      auVar71 = vshufps_avx(auVar88,auVar88,0x55);
      auVar70 = vshufps_avx(auVar88,auVar88,0xaa);
      auVar74._0_4_ = auVar70._0_4_ * fVar76;
      auVar74._4_4_ = auVar70._4_4_ * fVar147;
      auVar74._8_4_ = auVar70._8_4_ * fVar141;
      auVar74._12_4_ = auVar70._12_4_ * fVar144;
      auVar91._0_4_ = auVar71._0_4_ * b0.field_0._0_4_ + auVar74._0_4_;
      auVar91._4_4_ = auVar71._4_4_ * b0.field_0._4_4_ + auVar74._4_4_;
      auVar91._8_4_ = auVar71._8_4_ * b0.field_0._8_4_ + auVar74._8_4_;
      auVar91._12_4_ = auVar71._12_4_ * b0.field_0._12_4_ + auVar74._12_4_;
      auVar70 = vshufps_avx(auVar88,auVar88,0);
      auVar71._0_4_ = auVar70._0_4_ * aVar119._0_4_ + auVar91._0_4_;
      auVar71._4_4_ = auVar70._4_4_ * aVar119._4_4_ + auVar91._4_4_;
      auVar71._8_4_ = auVar70._8_4_ * aVar119._8_4_ + auVar91._8_4_;
      auVar71._12_4_ = auVar70._12_4_ * aVar119._12_4_ + auVar91._12_4_;
      auVar161 = vshufps_avx((undefined1  [16])a0.field_0,(undefined1  [16])a0.field_0,0xaa);
      auVar56 = vshufps_avx((undefined1  [16])a0.field_0,(undefined1  [16])a0.field_0,0x55);
      auVar70 = vshufps_avx((undefined1  [16])a0.field_0,(undefined1  [16])a0.field_0,0);
      auVar95._0_4_ = auVar70._0_4_ * aVar119._0_4_;
      auVar95._4_4_ = auVar70._4_4_ * aVar119._4_4_;
      auVar95._8_4_ = auVar70._8_4_ * aVar119._8_4_;
      auVar95._12_4_ = auVar70._12_4_ * aVar119._12_4_;
      auVar70._0_4_ = auVar95._0_4_ + auVar56._0_4_ * b0.field_0._0_4_ + auVar161._0_4_ * fVar76;
      auVar70._4_4_ = auVar95._4_4_ + auVar56._4_4_ * b0.field_0._4_4_ + auVar161._4_4_ * fVar147;
      auVar70._8_4_ = auVar95._8_4_ + auVar56._8_4_ * b0.field_0._8_4_ + auVar161._8_4_ * fVar141;
      auVar70._12_4_ =
           auVar95._12_4_ + auVar56._12_4_ * b0.field_0._12_4_ + auVar161._12_4_ * fVar144;
      auVar161._0_4_ = auVar75._0_4_ + auVar70._0_4_;
      auVar161._4_4_ = auVar75._4_4_ + auVar70._4_4_;
      auVar161._8_4_ = auVar75._8_4_ + auVar70._8_4_;
      auVar161._12_4_ = auVar75._12_4_ + auVar70._12_4_;
    }
    else {
      if (iVar4 < 0x9244) {
        if (iVar4 == 0x9134) {
          lVar11 = *plVar15;
          lVar18 = plVar15[2] * uVar10;
          uVar16 = *(uint *)(lVar11 + 0xc + lVar18);
          a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)ZEXT416(uVar16);
          auVar92 = vinsertps_avx(ZEXT416(*(uint *)(lVar11 + lVar18)),
                                  ZEXT416(*(uint *)(lVar11 + 0x10 + lVar18)),0x1c);
          auVar71 = vinsertps_avx(auVar92,ZEXT416(*(uint *)(lVar11 + 0x20 + lVar18)),0x28);
          auVar92 = vinsertps_avx(ZEXT416(*(uint *)(lVar11 + 4 + lVar18)),
                                  ZEXT416(*(uint *)(lVar11 + 0x14 + lVar18)),0x1c);
          auVar70 = vinsertps_avx(auVar92,ZEXT416(*(uint *)(lVar11 + 0x24 + lVar18)),0x28);
          auVar92 = vinsertps_avx(ZEXT416(*(uint *)(lVar11 + 8 + lVar18)),
                                  ZEXT416(*(uint *)(lVar11 + 0x18 + lVar18)),0x1c);
          a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vinsertps_avx(auVar92,ZEXT416(*(uint *)(lVar11 + 0x28 + lVar18)),0x28);
          auVar92 = vinsertps_avx(ZEXT416(uVar16),ZEXT416(*(uint *)(lVar11 + 0x1c + lVar18)),0x1c);
          auVar91 = vinsertps_avx(auVar92,ZEXT416(*(uint *)(lVar11 + 0x2c + lVar18)),0x28);
        }
        else if (iVar4 == 0x9234) {
          lVar11 = *plVar15;
          lVar18 = plVar15[2] * uVar10;
          auVar25._8_8_ = 0;
          auVar25._0_8_ = *(ulong *)(lVar11 + 4 + lVar18);
          auVar92 = vshufps_avx(ZEXT416(*(uint *)(lVar11 + lVar18)),auVar25,0x4c);
          auVar71 = vshufps_avx(auVar92,auVar92,0x78);
          auVar77._8_8_ = 0;
          auVar77._0_8_ = *(ulong *)(lVar11 + 0x10 + lVar18);
          auVar92 = vshufps_avx(ZEXT416(*(uint *)(lVar11 + 0xc + lVar18)),auVar77,0x4c);
          auVar70 = vshufps_avx(auVar92,auVar92,0x78);
          auVar93._8_8_ = 0;
          auVar93._0_8_ = *(ulong *)(lVar11 + 0x1c + lVar18);
          auVar92 = vshufps_avx(ZEXT416(*(uint *)(lVar11 + 0x18 + lVar18)),auVar93,0x4c);
          a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vshufps_avx(auVar92,auVar92,0x78);
          auVar94._8_8_ = 0;
          auVar94._0_8_ = *(ulong *)(lVar11 + 0x28 + lVar18);
          uVar16 = *(uint *)(lVar11 + 0x24 + lVar18);
          a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)ZEXT416(uVar16);
          auVar92 = vshufps_avx(ZEXT416(uVar16),auVar94,0x4c);
          auVar91 = vshufps_avx(auVar92,auVar92,0x78);
        }
      }
      else if (iVar4 == 0xb001) {
        lVar11 = *plVar15;
        lVar18 = plVar15[2] * uVar10;
        auVar27._8_8_ = 0;
        auVar27._0_8_ = *(ulong *)(lVar11 + 0x10 + lVar18);
        auVar92 = vinsertps_avx(auVar27,ZEXT416(*(uint *)(lVar11 + 8 + lVar18)),0x20);
        auVar28._8_8_ = 0;
        auVar28._0_8_ = *(ulong *)(lVar11 + 0x34 + lVar18);
        auVar71 = vmovlhps_avx(ZEXT416(*(uint *)(lVar11 + lVar18)),auVar28);
        auVar70 = vshufps_avx(auVar71,auVar28,0xd8);
        auVar115._8_8_ = 0;
        auVar115._0_8_ = *(ulong *)(lVar11 + 0x1c + lVar18);
        auVar71 = vmovlhps_avx(ZEXT416(*(uint *)(lVar11 + 0x18 + lVar18)),auVar115);
        auVar74 = vshufps_avx(auVar71,auVar115,0xd8);
        fVar147 = *(float *)(lVar11 + 0x24 + lVar18);
        fVar141 = *(float *)(lVar11 + 0x28 + lVar18);
        fVar144 = *(float *)(lVar11 + 0x2c + lVar18);
        fVar149 = *(float *)(lVar11 + 0x30 + lVar18);
        auVar75 = ZEXT416((uint)fVar149);
        fVar142 = fVar149 * fVar149 + fVar144 * fVar144 + fVar147 * fVar147 + fVar141 * fVar141;
        auVar71 = vrsqrtss_avx(ZEXT416((uint)fVar142),ZEXT416((uint)fVar142));
        fVar150 = auVar71._0_4_;
        fVar142 = fVar150 * 1.5 + fVar150 * fVar150 * fVar150 * fVar142 * -0.5;
        auVar91 = vinsertps_avx(auVar74,ZEXT416((uint)(fVar142 * fVar147)),0x30);
        auVar71 = vinsertps_avx(auVar70,ZEXT416((uint)(fVar142 * fVar141)),0x30);
        a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       ZEXT416((uint)(fVar142 * fVar144));
        b0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     ZEXT416((uint)(fVar142 * fVar149));
        auVar74 = vinsertps_avx(ZEXT416(*(uint *)(lVar11 + 0xc + lVar18)),
                                ZEXT416(*(uint *)(lVar11 + 4 + lVar18)),0x10);
        a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vinsertps_avx(auVar92,ZEXT416((uint)(fVar142 * fVar149)),0x30);
        auVar92 = vinsertps_avx(auVar74,ZEXT416(*(uint *)(lVar11 + 0x3c + lVar18)),0x20);
        auVar70 = vinsertps_avx(auVar92,ZEXT416((uint)(fVar142 * fVar144)),0x30);
      }
      else if (iVar4 == 0x9244) {
        lVar11 = *plVar15;
        lVar18 = plVar15[2] * uVar10;
        auVar71 = *(undefined1 (*) [16])(lVar11 + lVar18);
        auVar70 = *(undefined1 (*) [16])(lVar11 + 0x10 + lVar18);
        a0.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                      ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(lVar11 + 0x20 + lVar18))->v
        ;
        auVar91 = *(undefined1 (*) [16])(lVar11 + 0x30 + lVar18);
      }
      lVar11 = (ulong)(iVar12 + 1) * 0x38;
      plVar15 = (long *)(lVar19 + lVar11);
      iVar4 = *(int *)(lVar19 + 0x20 + lVar11);
      if (iVar4 < 0x9244) {
        if (iVar4 == 0x9134) {
          lVar19 = *plVar15;
          lVar11 = uVar10 * plVar15[2];
          auVar92 = vinsertps_avx(ZEXT416(*(uint *)(lVar19 + lVar11)),
                                  ZEXT416(*(uint *)(lVar19 + 0x10 + lVar11)),0x1c);
          a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                         vinsertps_avx(auVar92,ZEXT416(*(uint *)(lVar19 + 0x20 + lVar11)),0x28);
          auVar92 = vinsertps_avx(ZEXT416(*(uint *)(lVar19 + 4 + lVar11)),
                                  ZEXT416(*(uint *)(lVar19 + 0x14 + lVar11)),0x1c);
          auVar75 = vinsertps_avx(auVar92,ZEXT416(*(uint *)(lVar19 + 0x24 + lVar11)),0x28);
          auVar92 = vinsertps_avx(ZEXT416(*(uint *)(lVar19 + 8 + lVar11)),
                                  ZEXT416(*(uint *)(lVar19 + 0x18 + lVar11)),0x1c);
          auVar74 = vinsertps_avx(auVar92,ZEXT416(*(uint *)(lVar19 + 0x28 + lVar11)),0x28);
          auVar92 = vinsertps_avx(ZEXT416(*(uint *)(lVar19 + 0xc + lVar11)),
                                  ZEXT416(*(uint *)(lVar19 + 0x1c + lVar11)),0x1c);
          b0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vinsertps_avx(auVar92,ZEXT416(*(uint *)(lVar19 + 0x2c + lVar11)),0x28);
        }
        else if (iVar4 == 0x9234) {
          lVar19 = *plVar15;
          lVar11 = uVar10 * plVar15[2];
          auVar116._8_8_ = 0;
          auVar116._0_8_ = *(ulong *)(lVar19 + 4 + lVar11);
          auVar92 = vshufps_avx(ZEXT416(*(uint *)(lVar19 + lVar11)),auVar116,0x4c);
          a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                         vshufps_avx(auVar92,auVar92,0x78);
          auVar132._8_8_ = 0;
          auVar132._0_8_ = *(ulong *)(lVar19 + 0x10 + lVar11);
          auVar92 = vshufps_avx(ZEXT416(*(uint *)(lVar19 + 0xc + lVar11)),auVar132,0x4c);
          auVar75 = vshufps_avx(auVar92,auVar92,0x78);
          auVar133._8_8_ = 0;
          auVar133._0_8_ = *(ulong *)(lVar19 + 0x1c + lVar11);
          auVar92 = vshufps_avx(ZEXT416(*(uint *)(lVar19 + 0x18 + lVar11)),auVar133,0x4c);
          auVar74 = vshufps_avx(auVar92,auVar92,0x78);
          auVar134._8_8_ = 0;
          auVar134._0_8_ = *(ulong *)(lVar19 + 0x28 + lVar11);
          auVar92 = vshufps_avx(ZEXT416(*(uint *)(lVar19 + 0x24 + lVar11)),auVar134,0x4c);
          b0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vshufps_avx(auVar92,auVar92,0x78);
        }
      }
      else if (iVar4 == 0xb001) {
        lVar19 = *plVar15;
        lVar11 = uVar10 * plVar15[2];
        auVar117._8_8_ = 0;
        auVar117._0_8_ = *(ulong *)(lVar19 + 0x10 + lVar11);
        auVar92 = vinsertps_avx(auVar117,ZEXT416(*(uint *)(lVar19 + 8 + lVar11)),0x20);
        auVar118._8_8_ = 0;
        auVar118._0_8_ = *(ulong *)(lVar19 + 0x34 + lVar11);
        auVar75 = vmovlhps_avx(ZEXT416(*(uint *)(lVar19 + lVar11)),auVar118);
        auVar74 = vshufps_avx(auVar75,auVar118,0xd8);
        auVar152._8_8_ = 0;
        auVar152._0_8_ = *(ulong *)(lVar19 + 0x1c + lVar11);
        auVar75 = vmovlhps_avx(ZEXT416(*(uint *)(lVar19 + 0x18 + lVar11)),auVar152);
        auVar160 = vshufps_avx(auVar75,auVar152,0xd8);
        fVar147 = *(float *)(lVar19 + 0x24 + lVar11);
        fVar141 = *(float *)(lVar19 + 0x28 + lVar11);
        fVar144 = *(float *)(lVar19 + 0x2c + lVar11);
        fVar149 = *(float *)(lVar19 + 0x30 + lVar11);
        fVar142 = fVar149 * fVar149 + fVar144 * fVar144 + fVar147 * fVar147 + fVar141 * fVar141;
        auVar75 = vrsqrtss_avx(ZEXT416((uint)fVar142),ZEXT416((uint)fVar142));
        fVar150 = auVar75._0_4_;
        fVar142 = fVar150 * 1.5 + fVar150 * fVar150 * fVar150 * fVar142 * -0.5;
        b0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vinsertps_avx(auVar160,ZEXT416((uint)(fVar147 * fVar142)),0x30);
        a0_1.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vinsertps_avx(auVar74,ZEXT416((uint)(fVar141 * fVar142)),0x30);
        auVar75 = vinsertps_avx(ZEXT416(*(uint *)(lVar19 + 0xc + lVar11)),
                                ZEXT416(*(uint *)(lVar19 + 4 + lVar11)),0x10);
        auVar74 = vinsertps_avx(auVar92,ZEXT416((uint)(fVar149 * fVar142)),0x30);
        auVar92 = vinsertps_avx(auVar75,ZEXT416(*(uint *)(lVar19 + 0x3c + lVar11)),0x20);
        auVar75 = vinsertps_avx(auVar92,ZEXT416((uint)(fVar144 * fVar142)),0x30);
      }
      else if (iVar4 == 0x9244) {
        lVar19 = *plVar15;
        lVar11 = uVar10 * plVar15[2];
        a0_1.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                        ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(lVar19 + lVar11))->v;
        auVar75 = *(undefined1 (*) [16])(lVar19 + 0x10 + lVar11);
        auVar74 = *(undefined1 (*) [16])(lVar19 + 0x20 + lVar11);
        b0.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                      ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(lVar19 + 0x30 + lVar11))->v
        ;
      }
      auVar99 = vshufps_avx(auVar95,auVar95,0);
      fVar149 = auVar99._0_4_;
      aVar119._0_4_ = fVar149 * a0_1.field_0._0_4_;
      fVar142 = auVar99._4_4_;
      aVar119._4_4_ = fVar142 * a0_1.field_0._4_4_;
      fVar150 = auVar99._8_4_;
      aVar119._8_4_ = fVar150 * a0_1.field_0._8_4_;
      fVar113 = auVar99._12_4_;
      aVar119._12_4_ = fVar113 * a0_1.field_0._12_4_;
      auVar92 = vshufps_avx(ZEXT416((uint)(1.0 - fVar76)),ZEXT416((uint)(1.0 - fVar76)),0);
      fVar76 = auVar92._0_4_;
      fVar147 = auVar92._4_4_;
      fVar141 = auVar92._8_4_;
      fVar144 = auVar92._12_4_;
      auVar92._0_4_ = fVar76 * auVar71._0_4_ + aVar119._0_4_;
      auVar92._4_4_ = fVar147 * auVar71._4_4_ + aVar119._4_4_;
      auVar92._8_4_ = fVar141 * auVar71._8_4_ + aVar119._8_4_;
      auVar92._12_4_ = fVar144 * auVar71._12_4_ + aVar119._12_4_;
      auVar160._0_4_ = fVar76 * auVar70._0_4_ + fVar149 * auVar75._0_4_;
      auVar160._4_4_ = fVar147 * auVar70._4_4_ + fVar142 * auVar75._4_4_;
      auVar160._8_4_ = fVar141 * auVar70._8_4_ + fVar150 * auVar75._8_4_;
      auVar160._12_4_ = fVar144 * auVar70._12_4_ + fVar113 * auVar75._12_4_;
      auVar71._0_4_ = fVar76 * a0.field_0._0_4_ + fVar149 * auVar74._0_4_;
      auVar71._4_4_ = fVar147 * a0.field_0._4_4_ + fVar142 * auVar74._4_4_;
      auVar71._8_4_ = fVar141 * a0.field_0._8_4_ + fVar150 * auVar74._8_4_;
      auVar71._12_4_ = fVar144 * a0.field_0._12_4_ + fVar113 * auVar74._12_4_;
      auVar70._0_4_ = fVar149 * b0.field_0._0_4_;
      auVar70._4_4_ = fVar142 * b0.field_0._4_4_;
      auVar70._8_4_ = fVar150 * b0.field_0._8_4_;
      auVar70._12_4_ = fVar113 * b0.field_0._12_4_;
      auVar95._0_4_ = fVar76 * auVar91._0_4_;
      auVar95._4_4_ = fVar147 * auVar91._4_4_;
      auVar95._8_4_ = fVar141 * auVar91._8_4_;
      auVar95._12_4_ = fVar144 * auVar91._12_4_;
      auVar161._0_4_ = auVar95._0_4_ + auVar70._0_4_;
      auVar161._4_4_ = auVar95._4_4_ + auVar70._4_4_;
      auVar161._8_4_ = auVar95._8_4_ + auVar70._8_4_;
      auVar161._12_4_ = auVar95._12_4_ + auVar70._12_4_;
    }
  }
  uVar10 = (ulong)prim->primID_;
  if (pGVar5->numTimeSteps == 1) {
    plVar15 = *(long **)&pGVar5[1].fnumTimeSegments;
    iVar4 = (int)plVar15[4];
    if ((pGVar5->field_8).field_0x1 == '\x01') {
      if (iVar4 < 0x9244) {
        if (iVar4 == 0x9134) {
          lVar19 = *plVar15;
          lVar11 = uVar10 * plVar15[2];
          auVar70 = vinsertps_avx(ZEXT416(*(uint *)(lVar19 + lVar11)),
                                  ZEXT416(*(uint *)(lVar19 + 0x10 + lVar11)),0x1c);
          auVar91 = vinsertps_avx(auVar70,ZEXT416(*(uint *)(lVar19 + 0x20 + lVar11)),0x28);
          auVar70 = vinsertps_avx(ZEXT416(*(uint *)(lVar19 + 4 + lVar11)),
                                  ZEXT416(*(uint *)(lVar19 + 0x14 + lVar11)),0x1c);
          a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vinsertps_avx(auVar70,ZEXT416(*(uint *)(lVar19 + 0x24 + lVar11)),0x28);
          auVar70 = vinsertps_avx(ZEXT416(*(uint *)(lVar19 + 8 + lVar11)),
                                  ZEXT416(*(uint *)(lVar19 + 0x18 + lVar11)),0x1c);
          auVar95 = vinsertps_avx(auVar70,ZEXT416(*(uint *)(lVar19 + 0x28 + lVar11)),0x28);
          auVar70 = vinsertps_avx(ZEXT416(*(uint *)(lVar19 + 0xc + lVar11)),
                                  ZEXT416(*(uint *)(lVar19 + 0x1c + lVar11)),0x1c);
          auVar70 = vinsertps_avx(auVar70,ZEXT416(*(uint *)(lVar19 + 0x2c + lVar11)),0x28);
        }
        else if (iVar4 == 0x9234) {
          lVar19 = *plVar15;
          lVar11 = uVar10 * plVar15[2];
          auVar46._8_8_ = 0;
          auVar46._0_8_ = *(ulong *)(lVar19 + 4 + lVar11);
          auVar70 = vshufps_avx(ZEXT416(*(uint *)(lVar19 + lVar11)),auVar46,0x4c);
          auVar91 = vshufps_avx(auVar70,auVar70,0x78);
          auVar47._8_8_ = 0;
          auVar47._0_8_ = *(ulong *)(lVar19 + 0x10 + lVar11);
          auVar70 = vshufps_avx(ZEXT416(*(uint *)(lVar19 + 0xc + lVar11)),auVar47,0x4c);
          a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vshufps_avx(auVar70,auVar70,0x78);
          auVar48._8_8_ = 0;
          auVar48._0_8_ = *(ulong *)(lVar19 + 0x1c + lVar11);
          auVar70 = vshufps_avx(ZEXT416(*(uint *)(lVar19 + 0x18 + lVar11)),auVar48,0x4c);
          auVar95 = vshufps_avx(auVar70,auVar70,0x78);
          auVar49._8_8_ = 0;
          auVar49._0_8_ = *(ulong *)(lVar19 + 0x28 + lVar11);
          auVar70 = vshufps_avx(ZEXT416(*(uint *)(lVar19 + 0x24 + lVar11)),auVar49,0x4c);
          auVar70 = vshufps_avx(auVar70,auVar70,0x78);
        }
      }
      else if (iVar4 == 0xb001) {
        lVar19 = *plVar15;
        lVar11 = uVar10 * plVar15[2];
        auVar61._8_8_ = 0;
        auVar61._0_8_ = *(ulong *)(lVar19 + 0x10 + lVar11);
        auVar75 = vinsertps_avx(auVar61,ZEXT416(*(uint *)(lVar19 + 8 + lVar11)),0x20);
        auVar62._8_8_ = 0;
        auVar62._0_8_ = *(ulong *)(lVar19 + 0x34 + lVar11);
        auVar70 = vmovlhps_avx(ZEXT416(*(uint *)(lVar19 + lVar11)),auVar62);
        auVar74 = vshufps_avx(auVar70,auVar62,0xd8);
        auVar127._8_8_ = 0;
        auVar127._0_8_ = *(ulong *)(lVar19 + 0x1c + lVar11);
        auVar70 = vmovlhps_avx(ZEXT416(*(uint *)(lVar19 + 0x18 + lVar11)),auVar127);
        auVar91 = vshufps_avx(auVar70,auVar127,0xd8);
        fVar76 = *(float *)(lVar19 + 0x24 + lVar11);
        fVar147 = *(float *)(lVar19 + 0x28 + lVar11);
        fVar141 = *(float *)(lVar19 + 0x2c + lVar11);
        fVar144 = *(float *)(lVar19 + 0x30 + lVar11);
        fVar149 = fVar144 * fVar144 + fVar141 * fVar141 + fVar76 * fVar76 + fVar147 * fVar147;
        auVar70 = vrsqrtss_avx(ZEXT416((uint)fVar149),ZEXT416((uint)fVar149));
        fVar142 = auVar70._0_4_;
        fVar149 = fVar142 * 1.5 + fVar142 * fVar142 * fVar142 * fVar149 * -0.5;
        auVar70 = vinsertps_avx(auVar91,ZEXT416((uint)(fVar149 * fVar76)),0x30);
        auVar91 = vinsertps_avx(auVar74,ZEXT416((uint)(fVar149 * fVar147)),0x30);
        auVar74 = vinsertps_avx(ZEXT416(*(uint *)(lVar19 + 0xc + lVar11)),
                                ZEXT416(*(uint *)(lVar19 + 4 + lVar11)),0x10);
        auVar95 = vinsertps_avx(auVar75,ZEXT416((uint)(fVar149 * fVar144)),0x30);
        auVar75 = vinsertps_avx(auVar74,ZEXT416(*(uint *)(lVar19 + 0x3c + lVar11)),0x20);
        a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vinsertps_avx(auVar75,ZEXT416((uint)(fVar149 * fVar141)),0x30);
      }
      else if (iVar4 == 0x9244) {
        lVar19 = *plVar15;
        lVar11 = uVar10 * plVar15[2];
        auVar91 = *(undefined1 (*) [16])(lVar19 + lVar11);
        a0.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(lVar19 + 0x10 + lVar11);
        auVar95 = *(undefined1 (*) [16])(lVar19 + 0x20 + lVar11);
        auVar70 = *(undefined1 (*) [16])(lVar19 + 0x30 + lVar11);
      }
      auVar75 = vshufps_avx(auVar70,auVar70,0xff);
      auVar74 = vshufps_avx(auVar91,auVar91,0xff);
      auVar99 = vshufps_avx((undefined1  [16])a0.field_0,(undefined1  [16])a0.field_0,0xff);
      auVar56 = vshufps_avx(auVar95,auVar95,0xff);
      fVar138 = auVar74._0_4_;
      fVar131 = auVar75._0_4_;
      fVar113 = auVar99._0_4_;
      fVar151 = auVar56._0_4_;
      fVar76 = fVar138 * fVar113 + fVar131 * fVar151;
      fVar144 = fVar138 * fVar113 - fVar131 * fVar151;
      fVar149 = fVar131 * fVar131 - fVar138 * fVar138;
      fVar142 = fVar138 * fVar151 - fVar131 * fVar113;
      fVar147 = fVar138 * fVar151 + fVar131 * fVar113;
      fVar141 = fVar113 * fVar151 + fVar138 * fVar131;
      fVar150 = fVar113 * fVar151 - fVar138 * fVar131;
      auVar75 = ZEXT416((uint)(-fVar151 * fVar151 +
                              -fVar113 * fVar113 + fVar131 * fVar131 + fVar138 * fVar138));
      auVar75 = vshufps_avx(auVar75,auVar75,0);
      auVar74 = ZEXT416((uint)(fVar76 + fVar76));
      auVar74 = vshufps_avx(auVar74,auVar74,0);
      auVar99 = ZEXT416((uint)(fVar142 + fVar142));
      auVar99 = vshufps_avx(auVar99,auVar99,0);
      fVar131 = auVar74._0_4_ * 0.0 + auVar99._0_4_ * 0.0 + auVar75._0_4_ * 1.0;
      fVar138 = auVar74._4_4_ * 1.0 + auVar99._4_4_ * 0.0 + auVar75._4_4_ * 0.0;
      fVar139 = auVar74._8_4_ * 0.0 + auVar99._8_4_ * 1.0 + auVar75._8_4_ * 0.0;
      fVar140 = auVar74._12_4_ * 0.0 + auVar99._12_4_ * 0.0 + auVar75._12_4_ * 0.0;
      auVar75 = ZEXT416((uint)(-fVar151 * fVar151 + fVar113 * fVar113 + fVar149));
      auVar75 = vshufps_avx(auVar75,auVar75,0);
      auVar74 = ZEXT416((uint)(fVar141 + fVar141));
      auVar74 = vshufps_avx(auVar74,auVar74,0);
      auVar99 = ZEXT416((uint)(fVar144 + fVar144));
      auVar99 = vshufps_avx(auVar99,auVar99,0);
      fVar141 = auVar99._0_4_ * 1.0 + auVar75._0_4_ * 0.0 + auVar74._0_4_ * 0.0;
      fVar144 = auVar99._4_4_ * 0.0 + auVar75._4_4_ * 1.0 + auVar74._4_4_ * 0.0;
      fVar145 = auVar99._8_4_ * 0.0 + auVar75._8_4_ * 0.0 + auVar74._8_4_ * 1.0;
      fVar146 = auVar99._12_4_ * 0.0 + auVar75._12_4_ * 0.0 + auVar74._12_4_ * 0.0;
      auVar75 = ZEXT416((uint)(-fVar113 * fVar113 + fVar149 + fVar151 * fVar151));
      auVar74 = vshufps_avx(auVar75,auVar75,0);
      auVar75 = ZEXT416((uint)(fVar150 + fVar150));
      auVar99 = vshufps_avx(auVar75,auVar75,0);
      auVar75 = ZEXT416((uint)(fVar147 + fVar147));
      auVar56 = vshufps_avx(auVar75,auVar75,0);
      auVar75 = vshufps_avx(auVar91,ZEXT416(0) << 0x20,0xe9);
      auVar75 = vblendps_avx(auVar75,(undefined1  [16])a0.field_0,4);
      fVar147 = auVar56._0_4_ * 1.0 + auVar99._0_4_ * 0.0 + auVar74._0_4_ * 0.0;
      fVar149 = auVar56._4_4_ * 0.0 + auVar99._4_4_ * 1.0 + auVar74._4_4_ * 0.0;
      fVar150 = auVar56._8_4_ * 0.0 + auVar99._8_4_ * 0.0 + auVar74._8_4_ * 1.0;
      fVar151 = auVar56._12_4_ * 0.0 + auVar99._12_4_ * 0.0 + auVar74._12_4_ * 0.0;
      fVar142 = auVar75._0_4_;
      fVar113 = auVar75._4_4_;
      fVar156 = auVar75._8_4_;
      fVar76 = auVar75._12_4_;
      auVar75 = vshufps_avx(auVar91,auVar91,0);
      aVar119._0_4_ = auVar75._0_4_ * fVar131 + fVar147 * 0.0 + fVar141 * 0.0;
      aVar119._4_4_ = auVar75._4_4_ * fVar138 + fVar149 * 0.0 + fVar144 * 0.0;
      aVar119._8_4_ = auVar75._8_4_ * fVar139 + fVar150 * 0.0 + fVar145 * 0.0;
      aVar119._12_4_ = auVar75._12_4_ * fVar140 + fVar151 * 0.0 + fVar146 * 0.0;
      auVar75 = vshufps_avx((undefined1  [16])a0.field_0,(undefined1  [16])a0.field_0,0);
      auVar74 = vshufps_avx((undefined1  [16])a0.field_0,(undefined1  [16])a0.field_0,0x55);
      a0.field_0._0_4_ = auVar75._0_4_ * fVar131 + fVar147 * 0.0 + auVar74._0_4_ * fVar141;
      a0.field_0._4_4_ = auVar75._4_4_ * fVar138 + fVar149 * 0.0 + auVar74._4_4_ * fVar144;
      a0.field_0._8_4_ = auVar75._8_4_ * fVar139 + fVar150 * 0.0 + auVar74._8_4_ * fVar145;
      a0.field_0._12_4_ = auVar75._12_4_ * fVar140 + fVar151 * 0.0 + auVar74._12_4_ * fVar146;
      auVar75 = vshufps_avx(auVar95,auVar95,0x55);
      auVar74 = vshufps_avx(auVar95,auVar95,0xaa);
      auVar95 = vshufps_avx(auVar95,auVar95,0);
      auVar91._0_4_ = auVar95._0_4_ * fVar131 + auVar74._0_4_ * fVar147 + auVar75._0_4_ * fVar141;
      auVar91._4_4_ = auVar95._4_4_ * fVar138 + auVar74._4_4_ * fVar149 + auVar75._4_4_ * fVar144;
      auVar91._8_4_ = auVar95._8_4_ * fVar139 + auVar74._8_4_ * fVar150 + auVar75._8_4_ * fVar145;
      auVar91._12_4_ =
           auVar95._12_4_ * fVar140 + auVar74._12_4_ * fVar151 + auVar75._12_4_ * fVar146;
      auVar75 = vshufps_avx(auVar70,auVar70,0xaa);
      auVar74 = vshufps_avx(auVar70,auVar70,0x55);
      auVar70 = vshufps_avx(auVar70,auVar70,0);
      fVar147 = auVar70._0_4_ * fVar131 + auVar74._0_4_ * fVar141 + auVar75._0_4_ * fVar147;
      fVar141 = auVar70._4_4_ * fVar138 + auVar74._4_4_ * fVar144 + auVar75._4_4_ * fVar149;
      fVar144 = auVar70._8_4_ * fVar139 + auVar74._8_4_ * fVar145 + auVar75._8_4_ * fVar150;
      fVar149 = auVar70._12_4_ * fVar140 + auVar74._12_4_ * fVar146 + auVar75._12_4_ * fVar151;
LAB_01602152:
      auVar70._0_4_ = fVar142 + 0.0 + fVar147;
      auVar70._4_4_ = fVar113 + 0.0 + fVar141;
      auVar70._8_4_ = fVar156 + 0.0 + fVar144;
      auVar70._12_4_ = fVar76 + 0.0 + fVar149;
    }
    else if (iVar4 < 0x9244) {
      if (iVar4 == 0x9134) {
        lVar19 = *plVar15;
        lVar11 = uVar10 * plVar15[2];
        auVar70 = vinsertps_avx(ZEXT416(*(uint *)(lVar19 + lVar11)),
                                ZEXT416(*(uint *)(lVar19 + 0x10 + lVar11)),0x1c);
        aVar119 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                  vinsertps_avx(auVar70,ZEXT416(*(uint *)(lVar19 + 0x20 + lVar11)),0x28);
        auVar70 = vinsertps_avx(ZEXT416(*(uint *)(lVar19 + 4 + lVar11)),
                                ZEXT416(*(uint *)(lVar19 + 0x14 + lVar11)),0x1c);
        a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vinsertps_avx(auVar70,ZEXT416(*(uint *)(lVar19 + 0x24 + lVar11)),0x28);
        auVar70 = vinsertps_avx(ZEXT416(*(uint *)(lVar19 + 8 + lVar11)),
                                ZEXT416(*(uint *)(lVar19 + 0x18 + lVar11)),0x1c);
        auVar91 = vinsertps_avx(auVar70,ZEXT416(*(uint *)(lVar19 + 0x28 + lVar11)),0x28);
        auVar70 = vinsertps_avx(ZEXT416(*(uint *)(lVar19 + 0xc + lVar11)),
                                ZEXT416(*(uint *)(lVar19 + 0x1c + lVar11)),0x1c);
        auVar70 = vinsertps_avx(auVar70,ZEXT416(*(uint *)(lVar19 + 0x2c + lVar11)),0x28);
      }
      else if (iVar4 == 0x9234) {
        lVar19 = *plVar15;
        lVar11 = uVar10 * plVar15[2];
        auVar29._8_8_ = 0;
        auVar29._0_8_ = *(ulong *)(lVar19 + 4 + lVar11);
        auVar70 = vshufps_avx(ZEXT416(*(uint *)(lVar19 + lVar11)),auVar29,0x4c);
        aVar119 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vshufps_avx(auVar70,auVar70,0x78);
        auVar30._8_8_ = 0;
        auVar30._0_8_ = *(ulong *)(lVar19 + 0x10 + lVar11);
        auVar70 = vshufps_avx(ZEXT416(*(uint *)(lVar19 + 0xc + lVar11)),auVar30,0x4c);
        a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vshufps_avx(auVar70,auVar70,0x78);
        auVar31._8_8_ = 0;
        auVar31._0_8_ = *(ulong *)(lVar19 + 0x1c + lVar11);
        auVar70 = vshufps_avx(ZEXT416(*(uint *)(lVar19 + 0x18 + lVar11)),auVar31,0x4c);
        auVar91 = vshufps_avx(auVar70,auVar70,0x78);
        auVar32._8_8_ = 0;
        auVar32._0_8_ = *(ulong *)(lVar19 + 0x28 + lVar11);
        auVar70 = vshufps_avx(ZEXT416(*(uint *)(lVar19 + 0x24 + lVar11)),auVar32,0x4c);
        auVar70 = vshufps_avx(auVar70,auVar70,0x78);
      }
    }
    else if (iVar4 == 0xb001) {
      lVar19 = *plVar15;
      lVar11 = uVar10 * plVar15[2];
      auVar34._8_8_ = 0;
      auVar34._0_8_ = *(ulong *)(lVar19 + 0x10 + lVar11);
      auVar75 = vinsertps_avx(auVar34,ZEXT416(*(uint *)(lVar19 + 8 + lVar11)),0x20);
      auVar35._8_8_ = 0;
      auVar35._0_8_ = *(ulong *)(lVar19 + 0x34 + lVar11);
      auVar70 = vmovlhps_avx(ZEXT416(*(uint *)(lVar19 + lVar11)),auVar35);
      auVar74 = vshufps_avx(auVar70,auVar35,0xd8);
      auVar120._8_8_ = 0;
      auVar120._0_8_ = *(ulong *)(lVar19 + 0x1c + lVar11);
      auVar70 = vmovlhps_avx(ZEXT416(*(uint *)(lVar19 + 0x18 + lVar11)),auVar120);
      auVar91 = vshufps_avx(auVar70,auVar120,0xd8);
      fVar76 = *(float *)(lVar19 + 0x24 + lVar11);
      fVar147 = *(float *)(lVar19 + 0x28 + lVar11);
      fVar141 = *(float *)(lVar19 + 0x2c + lVar11);
      fVar144 = *(float *)(lVar19 + 0x30 + lVar11);
      fVar149 = fVar144 * fVar144 + fVar141 * fVar141 + fVar76 * fVar76 + fVar147 * fVar147;
      auVar70 = vrsqrtss_avx(ZEXT416((uint)fVar149),ZEXT416((uint)fVar149));
      fVar142 = auVar70._0_4_;
      fVar149 = fVar142 * 1.5 + fVar142 * fVar142 * fVar142 * fVar149 * -0.5;
      auVar70 = vinsertps_avx(auVar91,ZEXT416((uint)(fVar149 * fVar76)),0x30);
      aVar119 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                vinsertps_avx(auVar74,ZEXT416((uint)(fVar149 * fVar147)),0x30);
      auVar74 = vinsertps_avx(ZEXT416(*(uint *)(lVar19 + 0xc + lVar11)),
                              ZEXT416(*(uint *)(lVar19 + 4 + lVar11)),0x10);
      auVar91 = vinsertps_avx(auVar75,ZEXT416((uint)(fVar149 * fVar144)),0x30);
      auVar75 = vinsertps_avx(auVar74,ZEXT416(*(uint *)(lVar19 + 0x3c + lVar11)),0x20);
      a0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                   vinsertps_avx(auVar75,ZEXT416((uint)(fVar149 * fVar141)),0x30);
    }
    else if (iVar4 == 0x9244) {
      lVar19 = *plVar15;
      lVar11 = uVar10 * plVar15[2];
      aVar119 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                 ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(lVar19 + lVar11))->v;
      a0.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                    ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(lVar19 + 0x10 + lVar11))->v;
      auVar91 = *(undefined1 (*) [16])(lVar19 + 0x20 + lVar11);
      auVar70 = *(undefined1 (*) [16])(lVar19 + 0x30 + lVar11);
    }
  }
  else {
    fVar76 = (pGVar5->time_range).lower;
    fVar147 = (pGVar5->time_range).upper;
    auVar91 = ZEXT416((uint)fVar147);
    fVar76 = pGVar5->fnumTimeSegments * ((query->time - fVar76) / (fVar147 - fVar76));
    auVar70 = ZEXT416((uint)fVar76);
    auVar95 = vroundss_avx(ZEXT416((uint)fVar76),ZEXT416((uint)fVar76),9);
    auVar56 = vminss_avx(auVar95,ZEXT416((uint)(pGVar5->fnumTimeSegments + -1.0)));
    auVar85 = ZEXT816(0) << 0x20;
    auVar95 = SUB6416(ZEXT864(0),0) << 0x20;
    auVar56 = vmaxss_avx(auVar85,auVar56);
    iVar12 = (int)auVar56._0_4_;
    fVar76 = fVar76 - auVar56._0_4_;
    lVar19 = *(long *)&pGVar5[1].fnumTimeSegments;
    lVar11 = CONCAT44((int)((ulong)plVar15 >> 0x20),iVar12) * 0x38;
    plVar15 = (long *)(lVar19 + lVar11);
    iVar4 = *(int *)(lVar19 + 0x20 + lVar11);
    auVar126 = ZEXT416((uint)fVar76);
    if ((pGVar5->field_8).field_0x1 == '\x01') {
      auVar70 = auVar160;
      auVar75 = auVar92;
      auVar74 = auVar71;
      if (iVar4 < 0x9244) {
        if (iVar4 == 0x9134) {
          lVar11 = *plVar15;
          lVar18 = plVar15[2] * uVar10;
          uVar16 = *(uint *)(lVar11 + 8 + lVar18);
          auVar85 = ZEXT416(uVar16);
          auVar70 = vinsertps_avx(ZEXT416(*(uint *)(lVar11 + lVar18)),
                                  ZEXT416(*(uint *)(lVar11 + 0x10 + lVar18)),0x1c);
          auVar70 = vinsertps_avx(auVar70,ZEXT416(*(uint *)(lVar11 + 0x20 + lVar18)),0x28);
          auVar75 = vinsertps_avx(ZEXT416(*(uint *)(lVar11 + 4 + lVar18)),
                                  ZEXT416(*(uint *)(lVar11 + 0x14 + lVar18)),0x1c);
          auVar75 = vinsertps_avx(auVar75,ZEXT416(*(uint *)(lVar11 + 0x24 + lVar18)),0x28);
          auVar74 = vinsertps_avx(ZEXT416(uVar16),ZEXT416(*(uint *)(lVar11 + 0x18 + lVar18)),0x1c);
          _local_268 = vinsertps_avx(auVar74,ZEXT416(*(uint *)(lVar11 + 0x28 + lVar18)),0x28);
          auVar74 = vinsertps_avx(ZEXT416(*(uint *)(lVar11 + 0xc + lVar18)),
                                  ZEXT416(*(uint *)(lVar11 + 0x1c + lVar18)),0x1c);
          auVar74 = vinsertps_avx(auVar74,ZEXT416(*(uint *)(lVar11 + 0x2c + lVar18)),0x28);
        }
        else if (iVar4 == 0x9234) {
          lVar11 = *plVar15;
          lVar18 = plVar15[2] * uVar10;
          auVar50._8_8_ = 0;
          auVar50._0_8_ = *(ulong *)(lVar11 + 4 + lVar18);
          auVar70 = vshufps_avx(ZEXT416(*(uint *)(lVar11 + lVar18)),auVar50,0x4c);
          auVar70 = vshufps_avx(auVar70,auVar70,0x78);
          auVar51._8_8_ = 0;
          auVar51._0_8_ = *(ulong *)(lVar11 + 0x10 + lVar18);
          auVar75 = vshufps_avx(ZEXT416(*(uint *)(lVar11 + 0xc + lVar18)),auVar51,0x4c);
          auVar75 = vshufps_avx(auVar75,auVar75,0x78);
          auVar52._8_8_ = 0;
          auVar52._0_8_ = *(ulong *)(lVar11 + 0x1c + lVar18);
          auVar74 = vshufps_avx(ZEXT416(*(uint *)(lVar11 + 0x18 + lVar18)),auVar52,0x4c);
          _local_268 = vshufps_avx(auVar74,auVar74,0x78);
          auVar53._8_8_ = 0;
          auVar53._0_8_ = *(ulong *)(lVar11 + 0x28 + lVar18);
          auVar74 = vshufps_avx(ZEXT416(*(uint *)(lVar11 + 0x24 + lVar18)),auVar53,0x4c);
          auVar74 = vshufps_avx(auVar74,auVar74,0x78);
        }
      }
      else if (iVar4 == 0xb001) {
        lVar11 = *plVar15;
        lVar18 = plVar15[2] * uVar10;
        auVar63._8_8_ = 0;
        auVar63._0_8_ = *(ulong *)(lVar11 + 0x10 + lVar18);
        auVar75 = vinsertps_avx(auVar63,ZEXT416(*(uint *)(lVar11 + 8 + lVar18)),0x20);
        auVar86._8_8_ = 0;
        auVar86._0_8_ = *(ulong *)(lVar11 + 0x34 + lVar18);
        auVar70 = vmovlhps_avx(ZEXT416(*(uint *)(lVar11 + lVar18)),auVar86);
        auVar91 = vshufps_avx(auVar70,auVar86,0xd8);
        auVar128._8_8_ = 0;
        auVar128._0_8_ = *(ulong *)(lVar11 + 0x1c + lVar18);
        auVar70 = vmovlhps_avx(ZEXT416(*(uint *)(lVar11 + 0x18 + lVar18)),auVar128);
        auVar74 = vshufps_avx(auVar70,auVar128,0xd8);
        fVar147 = *(float *)(lVar11 + 0x24 + lVar18);
        fVar141 = *(float *)(lVar11 + 0x28 + lVar18);
        b0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)ZEXT416((uint)fVar141);
        fVar144 = *(float *)(lVar11 + 0x2c + lVar18);
        fVar149 = *(float *)(lVar11 + 0x30 + lVar18);
        fVar142 = fVar149 * fVar149 + fVar144 * fVar144 + fVar147 * fVar147 + fVar141 * fVar141;
        auVar70 = vrsqrtss_avx(ZEXT416((uint)fVar142),ZEXT416((uint)fVar142));
        fVar150 = auVar70._0_4_;
        auVar99 = ZEXT416((uint)(fVar150 * fVar150));
        fVar142 = fVar150 * 1.5 + fVar150 * fVar150 * fVar150 * fVar142 * -0.5;
        aVar119 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)ZEXT416((uint)(fVar142 * fVar147));
        auVar74 = vinsertps_avx(auVar74,ZEXT416((uint)(fVar142 * fVar147)),0x30);
        auVar70 = vinsertps_avx(auVar91,ZEXT416((uint)(fVar142 * fVar141)),0x30);
        auVar85 = ZEXT416((uint)(fVar142 * fVar149));
        auVar91 = vinsertps_avx(ZEXT416(*(uint *)(lVar11 + 0xc + lVar18)),
                                ZEXT416(*(uint *)(lVar11 + 4 + lVar18)),0x10);
        _local_268 = vinsertps_avx(auVar75,ZEXT416((uint)(fVar142 * fVar149)),0x30);
        auVar75 = vinsertps_avx(auVar91,ZEXT416(*(uint *)(lVar11 + 0x3c + lVar18)),0x20);
        auVar75 = vinsertps_avx(auVar75,ZEXT416((uint)(fVar142 * fVar144)),0x30);
      }
      else if (iVar4 == 0x9244) {
        lVar11 = *plVar15;
        lVar18 = plVar15[2] * uVar10;
        auVar70 = *(undefined1 (*) [16])(lVar11 + lVar18);
        auVar75 = *(undefined1 (*) [16])(lVar11 + 0x10 + lVar18);
        _local_268 = *(undefined1 (*) [16])(lVar11 + 0x20 + lVar18);
        auVar74 = *(undefined1 (*) [16])(lVar11 + 0x30 + lVar18);
      }
      lVar11 = (ulong)(iVar12 + 1) * 0x38;
      plVar15 = (long *)(lVar19 + lVar11);
      iVar4 = *(int *)(lVar19 + 0x20 + lVar11);
      if (iVar4 < 0x9244) {
        if (iVar4 == 0x9134) {
          lVar19 = *plVar15;
          lVar11 = uVar10 * plVar15[2];
          auVar91 = vinsertps_avx(ZEXT416(*(uint *)(lVar19 + lVar11)),
                                  ZEXT416(*(uint *)(lVar19 + 0x10 + lVar11)),0x1c);
          aVar119 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                    vinsertps_avx(auVar91,ZEXT416(*(uint *)(lVar19 + 0x20 + lVar11)),0x28);
          auVar91 = vinsertps_avx(ZEXT416(*(uint *)(lVar19 + 4 + lVar11)),
                                  ZEXT416(*(uint *)(lVar19 + 0x14 + lVar11)),0x1c);
          b0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vinsertps_avx(auVar91,ZEXT416(*(uint *)(lVar19 + 0x24 + lVar11)),0x28);
          auVar91 = vinsertps_avx(ZEXT416(*(uint *)(lVar19 + 8 + lVar11)),
                                  ZEXT416(*(uint *)(lVar19 + 0x18 + lVar11)),0x1c);
          auVar85 = vinsertps_avx(auVar91,ZEXT416(*(uint *)(lVar19 + 0x28 + lVar11)),0x28);
          auVar91 = vinsertps_avx(ZEXT416(*(uint *)(lVar19 + 0xc + lVar11)),
                                  ZEXT416(*(uint *)(lVar19 + 0x1c + lVar11)),0x1c);
          auVar99 = vinsertps_avx(auVar91,ZEXT416(*(uint *)(lVar19 + 0x2c + lVar11)),0x28);
        }
        else if (iVar4 == 0x9234) {
          lVar19 = *plVar15;
          lVar11 = uVar10 * plVar15[2];
          auVar64._8_8_ = 0;
          auVar64._0_8_ = *(ulong *)(lVar19 + 4 + lVar11);
          auVar91 = vshufps_avx(ZEXT416(*(uint *)(lVar19 + lVar11)),auVar64,0x4c);
          aVar119 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vshufps_avx(auVar91,auVar91,0x78)
          ;
          auVar65._8_8_ = 0;
          auVar65._0_8_ = *(ulong *)(lVar19 + 0x10 + lVar11);
          auVar91 = vshufps_avx(ZEXT416(*(uint *)(lVar19 + 0xc + lVar11)),auVar65,0x4c);
          b0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                       vshufps_avx(auVar91,auVar91,0x78);
          auVar66._8_8_ = 0;
          auVar66._0_8_ = *(ulong *)(lVar19 + 0x1c + lVar11);
          auVar91 = vshufps_avx(ZEXT416(*(uint *)(lVar19 + 0x18 + lVar11)),auVar66,0x4c);
          auVar85 = vshufps_avx(auVar91,auVar91,0x78);
          auVar67._8_8_ = 0;
          auVar67._0_8_ = *(ulong *)(lVar19 + 0x28 + lVar11);
          auVar91 = vshufps_avx(ZEXT416(*(uint *)(lVar19 + 0x24 + lVar11)),auVar67,0x4c);
          auVar99 = vshufps_avx(auVar91,auVar91,0x78);
        }
      }
      else if (iVar4 == 0xb001) {
        lVar19 = *plVar15;
        lVar11 = uVar10 * plVar15[2];
        auVar72._8_8_ = 0;
        auVar72._0_8_ = *(ulong *)(lVar19 + 0x10 + lVar11);
        auVar91 = vinsertps_avx(auVar72,ZEXT416(*(uint *)(lVar19 + 8 + lVar11)),0x20);
        auVar89._8_8_ = 0;
        auVar89._0_8_ = *(ulong *)(lVar19 + 0x34 + lVar11);
        auVar95 = vmovlhps_avx(ZEXT416(*(uint *)(lVar19 + lVar11)),auVar89);
        auVar56 = vshufps_avx(auVar95,auVar89,0xd8);
        auVar130._8_8_ = 0;
        auVar130._0_8_ = *(ulong *)(lVar19 + 0x1c + lVar11);
        auVar95 = vmovlhps_avx(ZEXT416(*(uint *)(lVar19 + 0x18 + lVar11)),auVar130);
        auVar99 = vshufps_avx(auVar95,auVar130,0xd8);
        fVar147 = *(float *)(lVar19 + 0x24 + lVar11);
        fVar141 = *(float *)(lVar19 + 0x28 + lVar11);
        fVar144 = *(float *)(lVar19 + 0x2c + lVar11);
        fVar149 = *(float *)(lVar19 + 0x30 + lVar11);
        fVar142 = fVar149 * fVar149 + fVar144 * fVar144 + fVar147 * fVar147 + fVar141 * fVar141;
        auVar95 = vrsqrtss_avx(ZEXT416((uint)fVar142),ZEXT416((uint)fVar142));
        fVar150 = auVar95._0_4_;
        fVar142 = fVar150 * 1.5 + fVar150 * fVar150 * fVar150 * fVar142 * -0.5;
        auVar99 = vinsertps_avx(auVar99,ZEXT416((uint)(fVar142 * fVar147)),0x30);
        aVar119 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                  vinsertps_avx(auVar56,ZEXT416((uint)(fVar142 * fVar141)),0x30);
        auVar95 = vinsertps_avx(ZEXT416(*(uint *)(lVar19 + 0xc + lVar11)),
                                ZEXT416(*(uint *)(lVar19 + 4 + lVar11)),0x10);
        auVar85 = vinsertps_avx(auVar91,ZEXT416((uint)(fVar142 * fVar149)),0x30);
        auVar91 = vinsertps_avx(auVar95,ZEXT416(*(uint *)(lVar19 + 0x3c + lVar11)),0x20);
        b0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vinsertps_avx(auVar91,ZEXT416((uint)(fVar142 * fVar144)),0x30);
      }
      else if (iVar4 == 0x9244) {
        lVar19 = *plVar15;
        lVar11 = uVar10 * plVar15[2];
        aVar119 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                   ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(lVar19 + lVar11))->v;
        b0.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                      ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(lVar19 + 0x10 + lVar11))->v
        ;
        auVar85 = *(undefined1 (*) [16])(lVar19 + 0x20 + lVar11);
        auVar99 = *(undefined1 (*) [16])(lVar19 + 0x30 + lVar11);
      }
      auVar91 = vshufps_avx(auVar74,auVar74,0xff);
      auVar95 = vshufps_avx(auVar70,auVar70,0xff);
      auVar56 = vshufps_avx(auVar75,auVar75,0xff);
      auVar68 = vpermilps_avx(_local_268,0xff);
      auVar42 = vshufps_avx(auVar99,auVar99,0xff);
      auVar43 = vshufps_avx((undefined1  [16])aVar119,(undefined1  [16])aVar119,0xff);
      auVar44 = vshufps_avx((undefined1  [16])b0.field_0,(undefined1  [16])b0.field_0,0xff);
      auVar45 = vshufps_avx(auVar85,auVar85,0xff);
      fVar149 = auVar95._0_4_;
      fVar142 = auVar91._0_4_;
      fVar144 = auVar56._0_4_;
      fVar141 = auVar68._0_4_;
      fVar147 = fVar141 * auVar45._0_4_ +
                auVar44._0_4_ * fVar144 + fVar142 * auVar42._0_4_ + auVar43._0_4_ * fVar149;
      auVar155._0_4_ = -fVar147;
      auVar155._4_4_ = 0x80000000;
      auVar155._8_4_ = 0x80000000;
      auVar155._12_4_ = 0x80000000;
      auVar103._0_8_ = auVar45._0_8_ ^ 0x8000000080000000;
      auVar103._8_4_ = auVar45._8_4_ ^ 0x80000000;
      auVar103._12_4_ = auVar45._12_4_ ^ 0x80000000;
      if (fVar147 < auVar155._0_4_) {
        auVar164._0_8_ = auVar42._0_8_ ^ 0x8000000080000000;
        auVar164._8_4_ = auVar42._8_4_ ^ 0x80000000;
        auVar164._12_4_ = auVar42._12_4_ ^ 0x80000000;
        auVar159._0_8_ = auVar43._0_8_ ^ 0x8000000080000000;
        auVar159._8_4_ = auVar43._8_4_ ^ 0x80000000;
        auVar159._12_4_ = auVar43._12_4_ ^ 0x80000000;
        auVar45 = auVar103;
        auVar42 = auVar164;
        auVar43 = auVar159;
      }
      auVar73._8_4_ = 0x7fffffff;
      auVar73._0_8_ = 0x7fffffff7fffffff;
      auVar73._12_4_ = 0x7fffffff;
      auVar91 = vandps_avx(ZEXT416((uint)fVar147),auVar73);
      fVar113 = auVar91._0_4_;
      auVar95 = vmaxss_avx(auVar155,ZEXT416((uint)fVar147));
      fVar150 = 1.0 - fVar113;
      fVar151 = auVar95._0_4_;
      if (fVar150 < 0.0) {
        fVar150 = sqrtf(fVar150);
        auVar95 = ZEXT416((uint)fVar151);
      }
      else {
        auVar56 = vsqrtss_avx(ZEXT416((uint)fVar150),ZEXT416((uint)fVar150));
        fVar150 = auVar56._0_4_;
      }
      auVar68 = vmaxss_avx(ZEXT816(0) << 0x40,
                           ZEXT416((uint)(1.5707964 -
                                         fVar150 * (fVar113 * (fVar113 * (fVar113 * (fVar113 * (
                                                  fVar113 * -0.0043095737 + 0.0192803) + -0.04489909
                                                  ) + 0.08785567) + -0.21450998) + 1.5707952))));
      auVar104._0_8_ = auVar68._0_8_ ^ 0x8000000080000000;
      auVar104._8_4_ = auVar68._8_4_ ^ 0x80000000;
      auVar104._12_4_ = auVar68._12_4_ ^ 0x80000000;
      auVar56 = vcmpss_avx(auVar95,ZEXT816(0) << 0x40,1);
      auVar56 = vblendvps_avx(auVar68,auVar104,auVar56);
      auVar91 = vcmpss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar91,1);
      auVar110._8_4_ = 0x7fc00000;
      auVar110._0_8_ = 0x7fc000007fc00000;
      auVar110._12_4_ = 0x7fc00000;
      auVar91 = vblendvps_avx(ZEXT416((uint)(1.5707964 - auVar56._0_4_)),auVar110,auVar91);
      fVar113 = fVar76 * auVar91._0_4_;
      auVar91 = ZEXT416((uint)(fVar113 * 0.63661975));
      auVar91 = vroundss_avx(auVar91,auVar91,9);
      uVar16 = (uint)auVar91._0_4_;
      fVar113 = fVar113 - auVar91._0_4_ * 1.5707964;
      fVar150 = fVar113 * fVar113;
      auVar111._0_8_ = auVar44._0_8_ ^ 0x8000000080000000;
      auVar111._8_4_ = auVar44._8_4_ ^ 0x80000000;
      auVar111._12_4_ = auVar44._12_4_ ^ 0x80000000;
      auVar91 = vcmpss_avx(ZEXT416((uint)fVar147),ZEXT416((uint)auVar155._0_4_),1);
      uVar13 = uVar16 & 3;
      fVar147 = fVar150 * (fVar150 * (fVar150 * (fVar150 * (fVar150 * -2.5963018e-07 + 2.4756235e-05
                                                           ) + -0.001388833) + 0.04166664) + -0.5) +
                1.0;
      fVar113 = fVar113 * (fVar150 * (fVar150 * (fVar150 * (fVar150 * (fVar150 * -2.5029328e-08 +
                                                                      2.7600126e-06) +
                                                           -0.00019842605) + 0.008333348) +
                                     -0.16666667) + 1.0);
      fVar150 = fVar147;
      if ((uVar16 & 1) != 0) {
        fVar150 = fVar113;
        fVar113 = fVar147;
      }
      auVar91 = vblendvps_avx(auVar44,auVar111,auVar91);
      if (1 < uVar13) {
        fVar113 = -fVar113;
      }
      if (uVar13 - 1 < 2) {
        fVar150 = -fVar150;
      }
      fVar147 = auVar95._0_4_;
      local_1a8 = auVar42._0_4_;
      fVar140 = fVar147 * fVar142 - local_1a8;
      local_198 = auVar43._0_4_;
      fVar145 = fVar147 * fVar149 - local_198;
      fVar146 = fVar147 * fVar144 - auVar91._0_4_;
      local_1b8 = auVar45._0_4_;
      fVar7 = fVar147 * fVar141 - local_1b8;
      fVar147 = fVar7 * fVar7 + fVar146 * fVar146 + fVar140 * fVar140 + fVar145 * fVar145;
      auVar95 = vrsqrtss_avx(ZEXT416((uint)fVar147),ZEXT416((uint)fVar147));
      fVar131 = auVar95._0_4_;
      fVar147 = fVar131 * 1.5 + fVar131 * fVar131 * fVar131 * fVar147 * -0.5;
      fVar8 = 1.0 - fVar76;
      fVar131 = fVar142 * fVar8 + local_1a8 * fVar76;
      fVar138 = fVar8 * fVar149 + fVar76 * local_198;
      fVar156 = fVar8 * fVar144 + auVar91._0_4_ * fVar76;
      fVar76 = fVar141 * fVar8 + local_1b8 * fVar76;
      fVar139 = fVar76 * fVar76 + fVar156 * fVar156 + fVar131 * fVar131 + fVar138 * fVar138;
      auVar91 = vrsqrtss_avx(ZEXT416((uint)fVar139),ZEXT416((uint)fVar139));
      fVar162 = auVar91._0_4_;
      fVar139 = fVar162 * 1.5 + fVar162 * fVar162 * fVar162 * fVar139 * -0.5;
      auVar91 = vcmpss_avx(SUB6416(ZEXT464(0x3f7fdf3b),0),ZEXT416((uint)fVar151),1);
      auVar91 = vblendvps_avx(ZEXT416((uint)(fVar142 * fVar150 - fVar147 * fVar140 * fVar113)),
                              ZEXT416((uint)(fVar131 * fVar139)),auVar91);
      if (0.9995 < fVar151) {
        fVar138 = fVar138 * fVar139;
        fVar156 = fVar156 * fVar139;
        fVar76 = fVar76 * fVar139;
      }
      else {
        fVar138 = fVar150 * fVar149 - fVar147 * fVar145 * fVar113;
        fVar156 = fVar144 * fVar150 - fVar147 * fVar146 * fVar113;
        fVar76 = fVar150 * fVar141 - fVar147 * fVar7 * fVar113;
      }
      local_168 = auVar74._0_4_;
      fStack_164 = auVar74._4_4_;
      fStack_160 = auVar74._8_4_;
      fStack_15c = auVar74._12_4_;
      local_178 = auVar75._0_4_;
      fStack_174 = auVar75._4_4_;
      fStack_170 = auVar75._8_4_;
      fStack_16c = auVar75._12_4_;
      auVar75 = vpermilps_avx(auVar126,0);
      local_e8 = aVar119.v[0];
      fStack_e4 = aVar119.v[1];
      fStack_e0 = aVar119.v[2];
      fStack_dc = aVar119.v[3];
      fVar147 = auVar75._0_4_;
      fVar141 = auVar75._4_4_;
      fVar144 = auVar75._8_4_;
      fVar149 = auVar75._12_4_;
      auVar75 = vshufps_avx(ZEXT416((uint)fVar8),ZEXT416((uint)fVar8),0);
      local_d8 = auVar70._0_4_;
      fStack_d4 = auVar70._4_4_;
      fStack_d0 = auVar70._8_4_;
      fStack_cc = auVar70._12_4_;
      fVar142 = auVar75._0_4_;
      fVar150 = auVar75._4_4_;
      fVar113 = auVar75._8_4_;
      fVar151 = auVar75._12_4_;
      auVar112._0_4_ = fVar142 * local_d8 + fVar147 * local_e8;
      auVar112._4_4_ = fVar150 * fStack_d4 + fVar141 * fStack_e4;
      auVar112._8_4_ = fVar113 * fStack_d0 + fVar144 * fStack_e0;
      auVar112._12_4_ = fVar151 * fStack_cc + fVar149 * fStack_dc;
      local_118 = b0.field_0._0_4_;
      fStack_114 = b0.field_0._4_4_;
      fStack_110 = b0.field_0._8_4_;
      fStack_10c = b0.field_0._12_4_;
      auVar105._0_4_ = local_178 * fVar142 + fVar147 * local_118;
      auVar105._4_4_ = fStack_174 * fVar150 + fVar141 * fStack_114;
      auVar105._8_4_ = fStack_170 * fVar113 + fVar144 * fStack_110;
      auVar105._12_4_ = fStack_16c * fVar151 + fVar149 * fStack_10c;
      local_108 = auVar85._0_4_;
      fStack_104 = auVar85._4_4_;
      fStack_100 = auVar85._8_4_;
      fStack_fc = auVar85._12_4_;
      auVar90._0_4_ = (float)local_268._0_4_ * fVar142 + fVar147 * local_108;
      auVar90._4_4_ = (float)local_268._4_4_ * fVar150 + fVar141 * fStack_104;
      auVar90._8_4_ = fStack_260 * fVar113 + fVar144 * fStack_100;
      auVar90._12_4_ = fStack_25c * fVar151 + fVar149 * fStack_fc;
      local_f8 = auVar99._0_4_;
      fStack_f4 = auVar99._4_4_;
      fStack_f0 = auVar99._8_4_;
      fStack_ec = auVar99._12_4_;
      local_268._4_4_ = fStack_164 * fVar150 + fVar141 * fStack_f4;
      local_268._0_4_ = local_168 * fVar142 + fVar147 * local_f8;
      fStack_260 = fStack_160 * fVar113 + fVar144 * fStack_f0;
      fStack_25c = fStack_15c * fVar151 + fVar149 * fStack_ec;
      fVar151 = auVar91._0_4_;
      fVar147 = fVar156 * fVar138 + fVar151 * fVar76;
      fVar149 = fVar156 * fVar138 - fVar151 * fVar76;
      fVar142 = fVar151 * fVar151 - fVar138 * fVar138;
      fVar150 = fVar138 * fVar76 - fVar156 * fVar151;
      fVar141 = fVar138 * fVar76 + fVar156 * fVar151;
      fVar144 = fVar156 * fVar76 + fVar151 * fVar138;
      fVar113 = fVar156 * fVar76 - fVar151 * fVar138;
      auVar70 = ZEXT416((uint)(-fVar76 * fVar76 +
                              -fVar156 * fVar156 + fVar151 * fVar151 + fVar138 * fVar138));
      auVar70 = vshufps_avx(auVar70,auVar70,0);
      auVar75 = ZEXT416((uint)(fVar147 + fVar147));
      auVar75 = vshufps_avx(auVar75,auVar75,0);
      auVar74 = ZEXT416((uint)(fVar150 + fVar150));
      auVar74 = vshufps_avx(auVar74,auVar74,0);
      fVar150 = auVar70._0_4_ * 1.0 + auVar75._0_4_ * 0.0 + auVar74._0_4_ * 0.0;
      fVar151 = auVar70._4_4_ * 0.0 + auVar75._4_4_ * 1.0 + auVar74._4_4_ * 0.0;
      fVar131 = auVar70._8_4_ * 0.0 + auVar75._8_4_ * 0.0 + auVar74._8_4_ * 1.0;
      fVar138 = auVar70._12_4_ * 0.0 + auVar75._12_4_ * 0.0 + auVar74._12_4_ * 0.0;
      auVar70 = ZEXT416((uint)(-fVar76 * fVar76 + fVar156 * fVar156 + fVar142));
      auVar70 = vshufps_avx(auVar70,auVar70,0);
      auVar75 = ZEXT416((uint)(fVar144 + fVar144));
      auVar75 = vshufps_avx(auVar75,auVar75,0);
      auVar74 = ZEXT416((uint)(fVar149 + fVar149));
      auVar74 = vshufps_avx(auVar74,auVar74,0);
      fVar139 = auVar74._0_4_ * 1.0 + auVar70._0_4_ * 0.0 + auVar75._0_4_ * 0.0;
      fVar140 = auVar74._4_4_ * 0.0 + auVar70._4_4_ * 1.0 + auVar75._4_4_ * 0.0;
      fVar145 = auVar74._8_4_ * 0.0 + auVar70._8_4_ * 0.0 + auVar75._8_4_ * 1.0;
      fVar146 = auVar74._12_4_ * 0.0 + auVar70._12_4_ * 0.0 + auVar75._12_4_ * 0.0;
      auVar70 = ZEXT416((uint)(-fVar156 * fVar156 + fVar142 + fVar76 * fVar76));
      auVar75 = vshufps_avx(auVar70,auVar70,0);
      auVar70 = ZEXT416((uint)(fVar113 + fVar113));
      auVar74 = vshufps_avx(auVar70,auVar70,0);
      auVar70 = ZEXT416((uint)(fVar141 + fVar141));
      auVar91 = vshufps_avx(auVar70,auVar70,0);
      auVar70 = vshufps_avx(auVar112,ZEXT416(0) << 0x20,0xe9);
      auVar70 = vblendps_avx(auVar70,auVar105,4);
      fVar147 = auVar91._0_4_ * 1.0 + auVar74._0_4_ * 0.0 + auVar75._0_4_ * 0.0;
      fVar141 = auVar91._4_4_ * 0.0 + auVar74._4_4_ * 1.0 + auVar75._4_4_ * 0.0;
      fVar144 = auVar91._8_4_ * 0.0 + auVar74._8_4_ * 0.0 + auVar75._8_4_ * 1.0;
      fVar149 = auVar91._12_4_ * 0.0 + auVar74._12_4_ * 0.0 + auVar75._12_4_ * 0.0;
      fVar142 = auVar70._0_4_;
      fVar113 = auVar70._4_4_;
      fVar156 = auVar70._8_4_;
      fVar76 = auVar70._12_4_;
      auVar70 = vshufps_avx(auVar112,auVar112,0);
      aVar119._0_4_ = auVar70._0_4_ * fVar150 + fVar147 * 0.0 + fVar139 * 0.0;
      aVar119._4_4_ = auVar70._4_4_ * fVar151 + fVar141 * 0.0 + fVar140 * 0.0;
      aVar119._8_4_ = auVar70._8_4_ * fVar131 + fVar144 * 0.0 + fVar145 * 0.0;
      aVar119._12_4_ = auVar70._12_4_ * fVar138 + fVar149 * 0.0 + fVar146 * 0.0;
      auVar70 = vshufps_avx(auVar105,auVar105,0);
      auVar75 = vshufps_avx(auVar105,auVar105,0x55);
      a0.field_0._0_4_ = auVar70._0_4_ * fVar150 + fVar147 * 0.0 + auVar75._0_4_ * fVar139;
      a0.field_0._4_4_ = auVar70._4_4_ * fVar151 + fVar141 * 0.0 + auVar75._4_4_ * fVar140;
      a0.field_0._8_4_ = auVar70._8_4_ * fVar131 + fVar144 * 0.0 + auVar75._8_4_ * fVar145;
      a0.field_0._12_4_ = auVar70._12_4_ * fVar138 + fVar149 * 0.0 + auVar75._12_4_ * fVar146;
      auVar70 = vshufps_avx(auVar90,auVar90,0x55);
      auVar75 = vshufps_avx(auVar90,auVar90,0xaa);
      auVar74 = vshufps_avx(auVar90,auVar90,0);
      auVar91._0_4_ = auVar74._0_4_ * fVar150 + auVar70._0_4_ * fVar139 + auVar75._0_4_ * fVar147;
      auVar91._4_4_ = auVar74._4_4_ * fVar151 + auVar70._4_4_ * fVar140 + auVar75._4_4_ * fVar141;
      auVar91._8_4_ = auVar74._8_4_ * fVar131 + auVar70._8_4_ * fVar145 + auVar75._8_4_ * fVar144;
      auVar91._12_4_ =
           auVar74._12_4_ * fVar138 + auVar70._12_4_ * fVar146 + auVar75._12_4_ * fVar149;
      auVar70 = vshufps_avx(_local_268,_local_268,0xaa);
      auVar75 = vshufps_avx(_local_268,_local_268,0x55);
      auVar74 = vshufps_avx(_local_268,_local_268,0);
      fVar147 = auVar74._0_4_ * fVar150 + auVar75._0_4_ * fVar139 + auVar70._0_4_ * fVar147;
      fVar141 = auVar74._4_4_ * fVar151 + auVar75._4_4_ * fVar140 + auVar70._4_4_ * fVar141;
      fVar144 = auVar74._8_4_ * fVar131 + auVar75._8_4_ * fVar145 + auVar70._8_4_ * fVar144;
      fVar149 = auVar74._12_4_ * fVar138 + auVar75._12_4_ * fVar146 + auVar70._12_4_ * fVar149;
      goto LAB_01602152;
    }
    if (iVar4 < 0x9244) {
      if (iVar4 == 0x9134) {
        lVar11 = *plVar15;
        lVar18 = plVar15[2] * uVar10;
        uVar16 = *(uint *)(lVar11 + 0xc + lVar18);
        aVar119 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)ZEXT416(uVar16);
        auVar70 = vinsertps_avx(ZEXT416(*(uint *)(lVar11 + lVar18)),
                                ZEXT416(*(uint *)(lVar11 + 0x10 + lVar18)),0x1c);
        auVar70 = vinsertps_avx(auVar70,ZEXT416(*(uint *)(lVar11 + 0x20 + lVar18)),0x28);
        auVar91 = vinsertps_avx(ZEXT416(*(uint *)(lVar11 + 4 + lVar18)),
                                ZEXT416(*(uint *)(lVar11 + 0x14 + lVar18)),0x1c);
        auVar91 = vinsertps_avx(auVar91,ZEXT416(*(uint *)(lVar11 + 0x24 + lVar18)),0x28);
        auVar95 = vinsertps_avx(ZEXT416(*(uint *)(lVar11 + 8 + lVar18)),
                                ZEXT416(*(uint *)(lVar11 + 0x18 + lVar18)),0x1c);
        auVar95 = vinsertps_avx(auVar95,ZEXT416(*(uint *)(lVar11 + 0x28 + lVar18)),0x28);
        auVar99 = vinsertps_avx(ZEXT416(uVar16),ZEXT416(*(uint *)(lVar11 + 0x1c + lVar18)),0x1c);
        auVar56 = vinsertps_avx(auVar99,ZEXT416(*(uint *)(lVar11 + 0x2c + lVar18)),0x28);
      }
      else if (iVar4 == 0x9234) {
        lVar11 = *plVar15;
        lVar18 = plVar15[2] * uVar10;
        auVar33._8_8_ = 0;
        auVar33._0_8_ = *(ulong *)(lVar11 + 4 + lVar18);
        auVar70 = vshufps_avx(ZEXT416(*(uint *)(lVar11 + lVar18)),auVar33,0x4c);
        auVar70 = vshufps_avx(auVar70,auVar70,0x78);
        auVar79._8_8_ = 0;
        auVar79._0_8_ = *(ulong *)(lVar11 + 0x10 + lVar18);
        auVar91 = vshufps_avx(ZEXT416(*(uint *)(lVar11 + 0xc + lVar18)),auVar79,0x4c);
        auVar91 = vshufps_avx(auVar91,auVar91,0x78);
        auVar80._8_8_ = 0;
        auVar80._0_8_ = *(ulong *)(lVar11 + 0x1c + lVar18);
        auVar95 = vshufps_avx(ZEXT416(*(uint *)(lVar11 + 0x18 + lVar18)),auVar80,0x4c);
        auVar95 = vshufps_avx(auVar95,auVar95,0x78);
        auVar81._8_8_ = 0;
        auVar81._0_8_ = *(ulong *)(lVar11 + 0x28 + lVar18);
        uVar16 = *(uint *)(lVar11 + 0x24 + lVar18);
        aVar119 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)ZEXT416(uVar16);
        auVar99 = vshufps_avx(ZEXT416(uVar16),auVar81,0x4c);
        auVar56 = vshufps_avx(auVar99,auVar99,0x78);
      }
    }
    else if (iVar4 == 0xb001) {
      lVar11 = *plVar15;
      lVar18 = plVar15[2] * uVar10;
      auVar36._8_8_ = 0;
      auVar36._0_8_ = *(ulong *)(lVar11 + 0x10 + lVar18);
      auVar91 = vinsertps_avx(auVar36,ZEXT416(*(uint *)(lVar11 + 8 + lVar18)),0x20);
      auVar37._8_8_ = 0;
      auVar37._0_8_ = *(ulong *)(lVar11 + 0x34 + lVar18);
      auVar70 = vmovlhps_avx(ZEXT416(*(uint *)(lVar11 + lVar18)),auVar37);
      auVar95 = vshufps_avx(auVar70,auVar37,0xd8);
      auVar121._8_8_ = 0;
      auVar121._0_8_ = *(ulong *)(lVar11 + 0x1c + lVar18);
      auVar70 = vmovlhps_avx(ZEXT416(*(uint *)(lVar11 + 0x18 + lVar18)),auVar121);
      auVar99 = vshufps_avx(auVar70,auVar121,0xd8);
      fVar147 = *(float *)(lVar11 + 0x24 + lVar18);
      fVar141 = *(float *)(lVar11 + 0x28 + lVar18);
      fVar144 = *(float *)(lVar11 + 0x2c + lVar18);
      auVar74 = ZEXT416((uint)fVar144);
      fVar149 = *(float *)(lVar11 + 0x30 + lVar18);
      auVar75 = ZEXT416((uint)fVar149);
      fVar142 = fVar149 * fVar149 + fVar144 * fVar144 + fVar147 * fVar147 + fVar141 * fVar141;
      auVar70 = vrsqrtss_avx(ZEXT416((uint)fVar142),ZEXT416((uint)fVar142));
      fVar150 = auVar70._0_4_;
      fVar142 = fVar150 * 1.5 + fVar150 * fVar150 * fVar150 * fVar142 * -0.5;
      auVar56 = vinsertps_avx(auVar99,ZEXT416((uint)(fVar142 * fVar147)),0x30);
      auVar70 = vinsertps_avx(auVar95,ZEXT416((uint)(fVar142 * fVar141)),0x30);
      aVar119 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)ZEXT416((uint)(fVar142 * fVar144));
      b0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)ZEXT416((uint)(fVar142 * fVar149))
      ;
      auVar99 = vinsertps_avx(ZEXT416(*(uint *)(lVar11 + 0xc + lVar18)),
                              ZEXT416(*(uint *)(lVar11 + 4 + lVar18)),0x10);
      auVar95 = vinsertps_avx(auVar91,ZEXT416((uint)(fVar142 * fVar149)),0x30);
      auVar91 = vinsertps_avx(auVar99,ZEXT416(*(uint *)(lVar11 + 0x3c + lVar18)),0x20);
      auVar91 = vinsertps_avx(auVar91,ZEXT416((uint)(fVar142 * fVar144)),0x30);
    }
    else if (iVar4 == 0x9244) {
      lVar11 = *plVar15;
      lVar18 = plVar15[2] * uVar10;
      auVar70 = *(undefined1 (*) [16])(lVar11 + lVar18);
      auVar91 = *(undefined1 (*) [16])(lVar11 + 0x10 + lVar18);
      auVar95 = *(undefined1 (*) [16])(lVar11 + 0x20 + lVar18);
      auVar56 = *(undefined1 (*) [16])(lVar11 + 0x30 + lVar18);
    }
    lVar11 = (ulong)(iVar12 + 1) * 0x38;
    plVar15 = (long *)(lVar19 + lVar11);
    iVar4 = *(int *)(lVar19 + 0x20 + lVar11);
    if (iVar4 < 0x9244) {
      if (iVar4 == 0x9134) {
        lVar19 = *plVar15;
        lVar11 = uVar10 * plVar15[2];
        auVar75 = vinsertps_avx(ZEXT416(*(uint *)(lVar19 + lVar11)),
                                ZEXT416(*(uint *)(lVar19 + 0x10 + lVar11)),0x1c);
        aVar119 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                  vinsertps_avx(auVar75,ZEXT416(*(uint *)(lVar19 + 0x20 + lVar11)),0x28);
        auVar75 = vinsertps_avx(ZEXT416(*(uint *)(lVar19 + 4 + lVar11)),
                                ZEXT416(*(uint *)(lVar19 + 0x14 + lVar11)),0x1c);
        auVar75 = vinsertps_avx(auVar75,ZEXT416(*(uint *)(lVar19 + 0x24 + lVar11)),0x28);
        auVar74 = vinsertps_avx(ZEXT416(*(uint *)(lVar19 + 8 + lVar11)),
                                ZEXT416(*(uint *)(lVar19 + 0x18 + lVar11)),0x1c);
        auVar74 = vinsertps_avx(auVar74,ZEXT416(*(uint *)(lVar19 + 0x28 + lVar11)),0x28);
        auVar99 = vinsertps_avx(ZEXT416(*(uint *)(lVar19 + 0xc + lVar11)),
                                ZEXT416(*(uint *)(lVar19 + 0x1c + lVar11)),0x1c);
        b0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vinsertps_avx(auVar99,ZEXT416(*(uint *)(lVar19 + 0x2c + lVar11)),0x28);
      }
      else if (iVar4 == 0x9234) {
        lVar19 = *plVar15;
        lVar11 = uVar10 * plVar15[2];
        auVar122._8_8_ = 0;
        auVar122._0_8_ = *(ulong *)(lVar19 + 4 + lVar11);
        auVar75 = vshufps_avx(ZEXT416(*(uint *)(lVar19 + lVar11)),auVar122,0x4c);
        aVar119 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vshufps_avx(auVar75,auVar75,0x78);
        auVar135._8_8_ = 0;
        auVar135._0_8_ = *(ulong *)(lVar19 + 0x10 + lVar11);
        auVar75 = vshufps_avx(ZEXT416(*(uint *)(lVar19 + 0xc + lVar11)),auVar135,0x4c);
        auVar75 = vshufps_avx(auVar75,auVar75,0x78);
        auVar136._8_8_ = 0;
        auVar136._0_8_ = *(ulong *)(lVar19 + 0x1c + lVar11);
        auVar74 = vshufps_avx(ZEXT416(*(uint *)(lVar19 + 0x18 + lVar11)),auVar136,0x4c);
        auVar74 = vshufps_avx(auVar74,auVar74,0x78);
        auVar137._8_8_ = 0;
        auVar137._0_8_ = *(ulong *)(lVar19 + 0x28 + lVar11);
        auVar99 = vshufps_avx(ZEXT416(*(uint *)(lVar19 + 0x24 + lVar11)),auVar137,0x4c);
        b0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vshufps_avx(auVar99,auVar99,0x78);
      }
    }
    else if (iVar4 == 0xb001) {
      lVar19 = *plVar15;
      lVar11 = uVar10 * plVar15[2];
      auVar123._8_8_ = 0;
      auVar123._0_8_ = *(ulong *)(lVar19 + 0x10 + lVar11);
      auVar75 = vinsertps_avx(auVar123,ZEXT416(*(uint *)(lVar19 + 8 + lVar11)),0x20);
      auVar124._8_8_ = 0;
      auVar124._0_8_ = *(ulong *)(lVar19 + 0x34 + lVar11);
      auVar74 = vmovlhps_avx(ZEXT416(*(uint *)(lVar19 + lVar11)),auVar124);
      auVar99 = vshufps_avx(auVar74,auVar124,0xd8);
      auVar153._8_8_ = 0;
      auVar153._0_8_ = *(ulong *)(lVar19 + 0x1c + lVar11);
      auVar74 = vmovlhps_avx(ZEXT416(*(uint *)(lVar19 + 0x18 + lVar11)),auVar153);
      auVar85 = vshufps_avx(auVar74,auVar153,0xd8);
      fVar147 = *(float *)(lVar19 + 0x24 + lVar11);
      fVar141 = *(float *)(lVar19 + 0x28 + lVar11);
      fVar144 = *(float *)(lVar19 + 0x2c + lVar11);
      fVar149 = *(float *)(lVar19 + 0x30 + lVar11);
      fVar142 = fVar149 * fVar149 + fVar144 * fVar144 + fVar147 * fVar147 + fVar141 * fVar141;
      auVar74 = vrsqrtss_avx(ZEXT416((uint)fVar142),ZEXT416((uint)fVar142));
      fVar150 = auVar74._0_4_;
      fVar142 = fVar150 * 1.5 + fVar150 * fVar150 * fVar150 * fVar142 * -0.5;
      b0.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                   vinsertps_avx(auVar85,ZEXT416((uint)(fVar147 * fVar142)),0x30);
      aVar119 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                vinsertps_avx(auVar99,ZEXT416((uint)(fVar141 * fVar142)),0x30);
      auVar99 = vinsertps_avx(ZEXT416(*(uint *)(lVar19 + 0xc + lVar11)),
                              ZEXT416(*(uint *)(lVar19 + 4 + lVar11)),0x10);
      auVar74 = vinsertps_avx(auVar75,ZEXT416((uint)(fVar149 * fVar142)),0x30);
      auVar75 = vinsertps_avx(auVar99,ZEXT416(*(uint *)(lVar19 + 0x3c + lVar11)),0x20);
      auVar75 = vinsertps_avx(auVar75,ZEXT416((uint)(fVar144 * fVar142)),0x30);
    }
    else if (iVar4 == 0x9244) {
      lVar19 = *plVar15;
      lVar11 = uVar10 * plVar15[2];
      aVar119 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                 ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(lVar19 + lVar11))->v;
      auVar75 = *(undefined1 (*) [16])(lVar19 + 0x10 + lVar11);
      auVar74 = *(undefined1 (*) [16])(lVar19 + 0x20 + lVar11);
      b0.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)
                    ((anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)(lVar19 + 0x30 + lVar11))->v;
    }
    auVar99 = vshufps_avx(auVar126,auVar126,0);
    fVar113 = auVar99._0_4_;
    fVar147 = aVar119.v[1];
    fVar151 = auVar99._4_4_;
    fVar141 = aVar119.v[2];
    fVar131 = auVar99._8_4_;
    fVar144 = aVar119.v[3];
    fVar138 = auVar99._12_4_;
    auVar99 = vshufps_avx(ZEXT416((uint)(1.0 - fVar76)),ZEXT416((uint)(1.0 - fVar76)),0);
    fVar76 = auVar99._0_4_;
    fVar149 = auVar99._4_4_;
    fVar142 = auVar99._8_4_;
    fVar150 = auVar99._12_4_;
    aVar119._0_4_ = fVar76 * auVar70._0_4_ + fVar113 * aVar119.v[0];
    aVar119._4_4_ = fVar149 * auVar70._4_4_ + fVar151 * fVar147;
    aVar119._8_4_ = fVar142 * auVar70._8_4_ + fVar131 * fVar141;
    aVar119._12_4_ = fVar150 * auVar70._12_4_ + fVar138 * fVar144;
    a0.field_0._0_4_ = fVar76 * auVar91._0_4_ + fVar113 * auVar75._0_4_;
    a0.field_0._4_4_ = fVar149 * auVar91._4_4_ + fVar151 * auVar75._4_4_;
    a0.field_0._8_4_ = fVar142 * auVar91._8_4_ + fVar131 * auVar75._8_4_;
    a0.field_0._12_4_ = fVar150 * auVar91._12_4_ + fVar138 * auVar75._12_4_;
    auVar91._0_4_ = fVar76 * auVar95._0_4_ + fVar113 * auVar74._0_4_;
    auVar91._4_4_ = fVar149 * auVar95._4_4_ + fVar151 * auVar74._4_4_;
    auVar91._8_4_ = fVar142 * auVar95._8_4_ + fVar131 * auVar74._8_4_;
    auVar91._12_4_ = fVar150 * auVar95._12_4_ + fVar138 * auVar74._12_4_;
    auVar70._0_4_ = fVar76 * auVar56._0_4_ + fVar113 * b0.field_0._0_4_;
    auVar70._4_4_ = fVar149 * auVar56._4_4_ + fVar151 * b0.field_0._4_4_;
    auVar70._8_4_ = fVar142 * auVar56._8_4_ + fVar131 * b0.field_0._8_4_;
    auVar70._12_4_ = fVar150 * auVar56._12_4_ + fVar138 * b0.field_0._12_4_;
  }
  auVar75 = vshufps_avx(auVar91,auVar91,0xc9);
  auVar74 = vshufps_avx((undefined1  [16])a0.field_0,(undefined1  [16])a0.field_0,0xc9);
  auVar143._0_4_ = auVar91._0_4_ * auVar74._0_4_;
  auVar143._4_4_ = auVar91._4_4_ * auVar74._4_4_;
  auVar143._8_4_ = auVar91._8_4_ * auVar74._8_4_;
  auVar143._12_4_ = auVar91._12_4_ * auVar74._12_4_;
  auVar148._0_4_ = a0.field_0._0_4_ * auVar75._0_4_;
  auVar148._4_4_ = a0.field_0._4_4_ * auVar75._4_4_;
  auVar148._8_4_ = a0.field_0._8_4_ * auVar75._8_4_;
  auVar148._12_4_ = a0.field_0._12_4_ * auVar75._12_4_;
  auVar56 = vsubps_avx(auVar148,auVar143);
  auVar95 = vshufps_avx(auVar56,auVar56,0xc9);
  auVar99 = vshufps_avx((undefined1  [16])aVar119,(undefined1  [16])aVar119,0xc9);
  auVar82._0_4_ = auVar75._0_4_ * aVar119.v[0];
  auVar82._4_4_ = auVar75._4_4_ * aVar119.v[1];
  auVar82._8_4_ = auVar75._8_4_ * aVar119.v[2];
  auVar82._12_4_ = auVar75._12_4_ * aVar119.v[3];
  auVar96._0_4_ = auVar99._0_4_ * auVar91._0_4_;
  auVar96._4_4_ = auVar99._4_4_ * auVar91._4_4_;
  auVar96._8_4_ = auVar99._8_4_ * auVar91._8_4_;
  auVar96._12_4_ = auVar99._12_4_ * auVar91._12_4_;
  auVar91 = vsubps_avx(auVar96,auVar82);
  auVar97._0_4_ = auVar99._0_4_ * a0.field_0._0_4_;
  auVar97._4_4_ = auVar99._4_4_ * a0.field_0._4_4_;
  auVar97._8_4_ = auVar99._8_4_ * a0.field_0._8_4_;
  auVar97._12_4_ = auVar99._12_4_ * a0.field_0._12_4_;
  auVar106._0_4_ = aVar119.v[0] * auVar74._0_4_;
  auVar106._4_4_ = aVar119.v[1] * auVar74._4_4_;
  auVar106._8_4_ = aVar119.v[2] * auVar74._8_4_;
  auVar106._12_4_ = aVar119.v[3] * auVar74._12_4_;
  auVar74 = vsubps_avx(auVar106,auVar97);
  auVar75 = vshufps_avx(auVar74,auVar74,0xc9);
  auVar99 = vunpcklps_avx(auVar95,auVar75);
  auVar74 = vunpcklps_avx(auVar56,auVar74);
  auVar75 = vinsertps_avx(auVar91,auVar91,0x4a);
  auVar56 = vunpcklps_avx(auVar74,ZEXT416(auVar91._0_4_));
  auVar85 = vunpcklps_avx(auVar99,auVar75);
  auVar74 = vunpckhps_avx(auVar99,auVar75);
  auVar75 = vdpps_avx((undefined1  [16])aVar119,auVar95,0x7f);
  auVar91 = vshufps_avx(auVar75,auVar75,0);
  auVar75 = vdivps_avx(auVar85,auVar91);
  auVar74 = vdivps_avx(auVar74,auVar91);
  auVar91 = vdivps_avx(auVar56,auVar91);
  auVar95 = vshufps_avx(auVar70,auVar70,0);
  auVar99 = vshufps_avx(auVar70,auVar70,0x55);
  auVar70 = vshufps_avx(auVar70,auVar70,0xaa);
  auVar157._0_4_ =
       auVar95._0_4_ * auVar75._0_4_ + auVar99._0_4_ * auVar74._0_4_ + auVar91._0_4_ * auVar70._0_4_
  ;
  auVar157._4_4_ =
       auVar95._4_4_ * auVar75._4_4_ + auVar99._4_4_ * auVar74._4_4_ + auVar91._4_4_ * auVar70._4_4_
  ;
  auVar157._8_4_ =
       auVar95._8_4_ * auVar75._8_4_ + auVar99._8_4_ * auVar74._8_4_ + auVar91._8_4_ * auVar70._8_4_
  ;
  auVar157._12_4_ =
       auVar95._12_4_ * auVar75._12_4_ +
       auVar99._12_4_ * auVar74._12_4_ + auVar91._12_4_ * auVar70._12_4_;
  if (context->query_type != POINT_QUERY_TYPE_SPHERE) {
    local_90 = 2;
    local_78 = 0.0;
    goto LAB_01600026;
  }
  auVar70 = vdpps_avx(auVar75,auVar74,0x7f);
  auVar98._8_4_ = 0x7fffffff;
  auVar98._0_8_ = 0x7fffffff7fffffff;
  auVar98._12_4_ = 0x7fffffff;
  auVar70 = vandps_avx(auVar70,auVar98);
  local_78 = 0.0;
  if (1e-05 < auVar70._0_4_) {
LAB_0160000e:
    bVar17 = false;
  }
  else {
    auVar70 = vdpps_avx(auVar75,auVar91,0x7f);
    auVar70 = vandps_avx(auVar70,auVar98);
    if (1e-05 < auVar70._0_4_) goto LAB_0160000e;
    auVar70 = vdpps_avx(auVar74,auVar91,0x7f);
    auVar70 = vandps_avx(auVar70,auVar98);
    if (1e-05 < auVar70._0_4_) goto LAB_0160000e;
    auVar95 = vdpps_avx(auVar75,auVar75,0x7f);
    auVar99 = vdpps_avx(auVar74,auVar74,0x7f);
    fVar76 = auVar95._0_4_;
    auVar70 = vandps_avx(ZEXT416((uint)(fVar76 - auVar99._0_4_)),auVar98);
    bVar17 = false;
    if (auVar70._0_4_ <= 1e-05) {
      auVar56 = vdpps_avx(auVar91,auVar91,0x7f);
      auVar70 = vandps_avx(ZEXT416((uint)(fVar76 - auVar56._0_4_)),auVar98);
      bVar17 = false;
      if (auVar70._0_4_ <= 1e-05) {
        auVar70 = vandps_avx(ZEXT416((uint)(auVar99._0_4_ - auVar56._0_4_)),auVar98);
        bVar17 = auVar70._0_4_ <= 1e-05;
        if (auVar70._0_4_ <= 1e-05) {
          bVar17 = true;
          if (fVar76 < 0.0) {
            local_78 = sqrtf(fVar76);
          }
          else {
            auVar70 = vsqrtss_avx(auVar95,auVar95);
            local_78 = auVar70._0_4_;
          }
        }
      }
    }
  }
  local_90 = 2 - (uint)bVar17;
LAB_01600026:
  pRVar6 = context->userContext;
  uVar16 = pRVar6->instStackSize;
  auVar83._8_8_ = 0;
  auVar83._0_4_ = prim->primID_;
  auVar83._4_4_ = prim->instID_;
  auVar70 = vshufps_avx(auVar83,auVar83,0xe1);
  uVar3 = vmovlps_avx(auVar70);
  *(undefined8 *)(pRVar6->instID + uVar16) = uVar3;
  *(undefined1 (*) [16])pRVar6->world2inst[uVar16] = auVar75;
  *(undefined1 (*) [16])(pRVar6->world2inst[uVar16] + 4) = auVar74;
  *(undefined1 (*) [16])(pRVar6->world2inst[uVar16] + 8) = auVar91;
  pfVar1 = pRVar6->world2inst[uVar16] + 0xc;
  *pfVar1 = -auVar157._0_4_;
  pfVar1[1] = -auVar157._4_4_;
  pfVar1[2] = -auVar157._8_4_;
  pfVar1[3] = -auVar157._12_4_;
  *(undefined1 (*) [16])pRVar6->inst2world[uVar16] = auVar92;
  *(undefined1 (*) [16])(pRVar6->inst2world[uVar16] + 4) = auVar160;
  *(undefined1 (*) [16])(pRVar6->inst2world[uVar16] + 8) = auVar71;
  *(undefined1 (*) [16])(pRVar6->inst2world[uVar16] + 0xc) = auVar161;
  pRVar6->instStackSize = pRVar6->instStackSize + 1;
  local_bc = query->time;
  fVar76 = (query->p).field_0.field_0.x;
  fVar147 = (query->p).field_0.field_0.y;
  fVar141 = (query->p).field_0.field_0.z;
  auVar107._0_4_ = auVar91._0_4_ * fVar141;
  auVar107._4_4_ = auVar91._4_4_ * fVar141;
  auVar107._8_4_ = auVar91._8_4_ * fVar141;
  auVar107._12_4_ = auVar91._12_4_ * fVar141;
  auVar92 = vsubps_avx(auVar107,auVar157);
  auVar84._0_4_ = auVar75._0_4_ * fVar76 + auVar74._0_4_ * fVar147 + auVar92._0_4_;
  auVar84._4_4_ = auVar75._4_4_ * fVar76 + auVar74._4_4_ * fVar147 + auVar92._4_4_;
  auVar84._8_4_ = auVar75._8_4_ * fVar76 + auVar74._8_4_ * fVar147 + auVar92._8_4_;
  auVar84._12_4_ = auVar75._12_4_ * fVar76 + auVar74._12_4_ * fVar147 + auVar92._12_4_;
  local_c8 = vmovlps_avx(auVar84);
  local_c0 = vextractps_avx(auVar84,2);
  local_b8 = local_78 * query->radius;
  local_98 = context->query_ws;
  local_70 = context->userPtr;
  local_a0 = 0;
  local_88._0_8_ = context->func;
  local_88._8_8_ = context->userContext;
  local_68 = 0xffffffffffffffff;
  local_58._4_4_ = local_98->radius;
  local_58._0_4_ = local_58._4_4_;
  fStack_50 = (float)local_58._4_4_;
  fStack_4c = (float)local_58._4_4_;
  fVar76 = local_98->radius;
  local_a8 = p_Var20;
  if (local_90 == 2) {
    if ((INFINITY <= fVar76) || (lVar19 = vpextrq_avx(local_88,1), *(int *)(lVar19 + 0x88) == 0)) {
      local_48 = vshufps_avx(ZEXT416((uint)fVar76),ZEXT416((uint)fVar76),0);
    }
    else {
      pointQuery();
    }
  }
  else {
    local_48 = vshufps_avx(ZEXT416((uint)(local_78 * fVar76)),ZEXT416((uint)(local_78 * fVar76)),0);
  }
  _local_58 = local_48;
  uVar9 = (**(code **)(p_Var20 + 0x88))(p_Var20 + 0x58,&local_c8);
  pRVar6 = context->userContext;
  uVar16 = pRVar6->instStackSize - 1;
  pRVar6->instStackSize = uVar16;
  pRVar6->instID[uVar16] = 0xffffffff;
  pRVar6->instPrimID[pRVar6->instStackSize] = 0xffffffff;
  return (bool)uVar9;
}

Assistant:

bool InstanceArrayIntersector1MB::pointQuery(PointQuery* query, PointQueryContext* context, const Primitive& prim)
    {
      const InstanceArray* instance = context->scene->get<InstanceArray>(prim.instID_);
      Accel* object = instance->getObject(prim.primID_);
      if (!object) return false;

      const AffineSpace3fa local2world = instance->getLocal2World(prim.primID_, query->time);
      const AffineSpace3fa world2local = instance->getWorld2Local(prim.primID_, query->time);
      float similarityScale = 0.f;
      const bool similtude = context->query_type == POINT_QUERY_TYPE_SPHERE
                           && similarityTransform(world2local, &similarityScale);

      if (likely(instance_id_stack::push(context->userContext, prim.instID_, prim.primID_, world2local, local2world)))
      {
        PointQuery query_inst;
        query_inst.time = query->time;
        query_inst.p = xfmPoint(world2local, query->p); 
        query_inst.radius = query->radius * similarityScale;

        PointQueryContext context_inst(
          (Scene*)object, 
          context->query_ws, 
          similtude ? POINT_QUERY_TYPE_SPHERE : POINT_QUERY_TYPE_AABB,
          context->func, 
          context->userContext,
          similarityScale,
          context->userPtr); 

        bool changed = object->intersectors.pointQuery(&query_inst, &context_inst);
        instance_id_stack::pop(context->userContext);
        return changed;
      }
      return false;
    }